

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar61 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  int iVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar143;
  vint4 ai_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar178;
  float fVar179;
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar180;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128 a;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  vfloat4 a0_2;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar218;
  float fVar219;
  vfloat4 a0_3;
  undefined1 auVar209 [16];
  float fVar220;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar236;
  vfloat4 b0_2;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [48];
  vfloat4 b0_3;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_640 [4];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar23;
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  float fVar134;
  float fVar142;
  
  uVar22 = (ulong)(byte)prim[1];
  lVar25 = uVar22 * 0x25;
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xf + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x11 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1a + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1b + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1c + 6)));
  uVar98 = *(undefined4 *)(prim + lVar25 + 0x12);
  auVar248._4_4_ = uVar98;
  auVar248._0_4_ = uVar98;
  auVar248._8_4_ = uVar98;
  auVar248._12_4_ = uVar98;
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar34 = vsubps_avx512vl(auVar49,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar143 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar53 = vpmovsxwd_avx(auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar22 * 0xb + 6);
  auVar54 = vpmovsxwd_avx(auVar52);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar55 = vpmovsxwd_avx(auVar57);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar22 * 0xd + 6);
  auVar56 = vpmovsxwd_avx(auVar50);
  auVar35 = vpbroadcastd_avx512vl();
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar22 * 0x12 + 6);
  auVar36 = vpmovsxwd_avx512vl(auVar58);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar22 * 0x16 + 6);
  auVar37 = vpmovsxwd_avx512vl(auVar40);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar22 * 0x14 + 6);
  auVar38 = vpmovsxwd_avx512vl(auVar39);
  auVar257 = ZEXT1664(auVar38);
  auVar49 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar49 = vinsertps_avx512f(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar39 = vmulps_avx512vl(auVar248,auVar34);
  auVar40 = vmulps_avx512vl(auVar248,auVar49);
  auVar41 = vcvtdq2ps_avx512vl(auVar41);
  auVar42 = vcvtdq2ps_avx512vl(auVar42);
  auVar260 = ZEXT1664(auVar42);
  auVar43 = vcvtdq2ps_avx512vl(auVar43);
  auVar44 = vcvtdq2ps_avx512vl(auVar44);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar49 = vcvtdq2ps_avx(auVar46);
  auVar52 = vcvtdq2ps_avx(auVar47);
  auVar57 = vcvtdq2ps_avx(auVar48);
  auVar50 = vcvtdq2ps_avx(auVar51);
  uVar98 = auVar40._0_4_;
  auVar203._4_4_ = uVar98;
  auVar203._0_4_ = uVar98;
  auVar203._8_4_ = uVar98;
  auVar203._12_4_ = uVar98;
  auVar58 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar46 = vmulps_avx512vl(auVar40,auVar43);
  auVar105._0_4_ = auVar40._0_4_ * auVar49._0_4_;
  auVar105._4_4_ = auVar40._4_4_ * auVar49._4_4_;
  auVar105._8_4_ = auVar40._8_4_ * auVar49._8_4_;
  auVar105._12_4_ = auVar40._12_4_ * auVar49._12_4_;
  auVar61._0_4_ = auVar50._0_4_ * auVar40._0_4_;
  auVar61._4_4_ = auVar50._4_4_ * auVar40._4_4_;
  auVar61._8_4_ = auVar50._8_4_ * auVar40._8_4_;
  auVar61._12_4_ = auVar50._12_4_ * auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar46,auVar58,auVar42);
  auVar46 = vfmadd231ps_avx512vl(auVar105,auVar58,auVar45);
  auVar58 = vfmadd231ps_fma(auVar61,auVar57,auVar58);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar203,auVar41);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar203,auVar44);
  auVar58 = vfmadd231ps_fma(auVar58,auVar52,auVar203);
  auVar47 = vbroadcastss_avx512vl(auVar39);
  auVar48 = vshufps_avx512vl(auVar39,auVar39,0x55);
  auVar39 = vshufps_avx512vl(auVar39,auVar39,0xaa);
  auVar43 = vmulps_avx512vl(auVar39,auVar43);
  auVar49 = vmulps_avx512vl(auVar39,auVar49);
  auVar50 = vmulps_avx512vl(auVar39,auVar50);
  auVar39 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar42);
  auVar42 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar45);
  auVar49 = vfmadd231ps_fma(auVar50,auVar48,auVar57);
  auVar48 = vfmadd231ps_avx512vl(auVar39,auVar47,auVar41);
  auVar51 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar44);
  auVar47 = vfmadd231ps_fma(auVar49,auVar47,auVar52);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar263 = ZEXT1664(auVar49);
  auVar52 = vandps_avx512vl(auVar40,auVar49);
  auVar225._8_4_ = 0x219392ef;
  auVar225._0_8_ = 0x219392ef219392ef;
  auVar225._12_4_ = 0x219392ef;
  uVar28 = vcmpps_avx512vl(auVar52,auVar225,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar34._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._12_4_;
  auVar52 = vandps_avx512vl(auVar46,auVar49);
  uVar28 = vcmpps_avx512vl(auVar52,auVar225,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar59._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._12_4_;
  auVar49 = vandps_avx512vl(auVar58,auVar49);
  uVar28 = vcmpps_avx512vl(auVar49,auVar225,1);
  bVar29 = (bool)((byte)uVar28 & 1);
  auVar60._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._0_4_;
  bVar29 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._4_4_;
  bVar29 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._8_4_;
  bVar29 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._12_4_;
  auVar52 = vrcp14ps_avx512vl(auVar34);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar34,auVar52,auVar226);
  auVar57 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar59);
  auVar49 = vfnmadd213ps_fma(auVar59,auVar52,auVar226);
  auVar50 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar60);
  auVar49 = vfnmadd213ps_fma(auVar60,auVar52,auVar226);
  auVar58 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar135._4_4_ = fVar143;
  auVar135._0_4_ = fVar143;
  auVar135._8_4_ = fVar143;
  auVar135._12_4_ = fVar143;
  auVar49 = vcvtdq2ps_avx(auVar53);
  auVar52 = vcvtdq2ps_avx(auVar54);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar40 = vfmadd213ps_fma(auVar52,auVar135,auVar49);
  auVar49 = vcvtdq2ps_avx(auVar55);
  auVar52 = vcvtdq2ps_avx(auVar56);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar39 = vfmadd213ps_fma(auVar52,auVar135,auVar49);
  auVar52 = vcvtdq2ps_avx512vl(auVar36);
  auVar49 = vcvtdq2ps_avx512vl(auVar37);
  auVar49 = vsubps_avx(auVar49,auVar52);
  auVar46 = vfmadd213ps_fma(auVar49,auVar135,auVar52);
  auVar52 = vcvtdq2ps_avx512vl(auVar38);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar22 * 0x18 + 6);
  auVar49 = vpmovsxwd_avx(auVar41);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar49 = vsubps_avx(auVar49,auVar52);
  auVar41 = vfmadd213ps_fma(auVar49,auVar135,auVar52);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar22 * 0x1d + 6);
  auVar49 = vpmovsxwd_avx(auVar42);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar22 * 0x21 + 6);
  auVar52 = vpmovsxwd_avx(auVar43);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar42 = vfmadd213ps_fma(auVar52,auVar135,auVar49);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar22 * 0x1f + 6);
  auVar49 = vpmovsxwd_avx(auVar44);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar22 * 0x23 + 6);
  auVar52 = vpmovsxwd_avx(auVar45);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar52 = vfmadd213ps_fma(auVar52,auVar135,auVar49);
  auVar49 = vsubps_avx512vl(auVar40,auVar48);
  auVar56._0_4_ = auVar57._0_4_ * auVar49._0_4_;
  auVar56._4_4_ = auVar57._4_4_ * auVar49._4_4_;
  auVar56._8_4_ = auVar57._8_4_ * auVar49._8_4_;
  auVar56._12_4_ = auVar57._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx512vl(auVar39,auVar48);
  auVar55._0_4_ = auVar57._0_4_ * auVar49._0_4_;
  auVar55._4_4_ = auVar57._4_4_ * auVar49._4_4_;
  auVar55._8_4_ = auVar57._8_4_ * auVar49._8_4_;
  auVar55._12_4_ = auVar57._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar46,auVar51);
  auVar37._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar37._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar37._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar37._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar41,auVar51);
  auVar54._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar54._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar54._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar54._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar42,auVar47);
  auVar38._0_4_ = auVar58._0_4_ * auVar49._0_4_;
  auVar38._4_4_ = auVar58._4_4_ * auVar49._4_4_;
  auVar38._8_4_ = auVar58._8_4_ * auVar49._8_4_;
  auVar38._12_4_ = auVar58._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar52,auVar47);
  auVar53._0_4_ = auVar58._0_4_ * auVar49._0_4_;
  auVar53._4_4_ = auVar58._4_4_ * auVar49._4_4_;
  auVar53._8_4_ = auVar58._8_4_ * auVar49._8_4_;
  auVar53._12_4_ = auVar58._12_4_ * auVar49._12_4_;
  auVar49 = vpminsd_avx(auVar56,auVar55);
  auVar52 = vpminsd_avx(auVar37,auVar54);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar52 = vpminsd_avx(auVar38,auVar53);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar46._4_4_ = uVar98;
  auVar46._0_4_ = uVar98;
  auVar46._8_4_ = uVar98;
  auVar46._12_4_ = uVar98;
  auVar52 = vmaxps_avx512vl(auVar52,auVar46);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar47._8_4_ = 0x3f7ffffa;
  auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar47._12_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar49,auVar47);
  auVar49 = vpmaxsd_avx(auVar56,auVar55);
  auVar52 = vpmaxsd_avx(auVar37,auVar54);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar52 = vpmaxsd_avx(auVar38,auVar53);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar48._4_4_ = uVar98;
  auVar48._0_4_ = uVar98;
  auVar48._8_4_ = uVar98;
  auVar48._12_4_ = uVar98;
  auVar52 = vminps_avx512vl(auVar52,auVar48);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar51._8_4_ = 0x3f800003;
  auVar51._0_8_ = 0x3f8000033f800003;
  auVar51._12_4_ = 0x3f800003;
  auVar49 = vmulps_avx512vl(auVar49,auVar51);
  uVar14 = vcmpps_avx512vl(local_5c0,auVar49,2);
  uVar15 = vpcmpgtd_avx512vl(auVar35,_DAT_01f4ad30);
  uVar28 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar14 & 0xf & (byte)uVar15));
  auVar104 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar104);
  auVar49 = vpxord_avx512vl(auVar36,auVar36);
  auVar104 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar262 = ZEXT1664(auVar49);
LAB_018c7357:
  if (uVar28 == 0) {
LAB_018c927b:
    return uVar28 != 0;
  }
  lVar25 = 0;
  for (uVar22 = uVar28; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar143 = (pGVar8->time_range).lower;
  fVar143 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar143) / ((pGVar8->time_range).upper - fVar143));
  auVar49 = vroundss_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),9);
  auVar52 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar49 = vminss_avx(auVar49,auVar52);
  auVar56 = auVar104._0_16_;
  auVar51 = vmaxss_avx512f(auVar56,auVar49);
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar25 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar27 = (long)(int)auVar51._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar27);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar27);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar22);
  lVar25 = uVar22 + 1;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  lVar1 = uVar22 + 2;
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar22 + 3;
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar27);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar27);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar22);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar39 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar41 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar27);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar27);
  auVar42 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar22);
  auVar43 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar44 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar104 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar104);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar27);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar27);
  auVar46 = *(undefined1 (*) [16])(lVar11 + uVar22 * lVar10);
  auVar247 = auVar104._16_48_;
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar25 * lVar10);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar51 = vsubss_avx512f(ZEXT416((uint)fVar143),auVar51);
  auVar104._0_16_ = vxorps_avx512vl(auVar260._0_16_,auVar260._0_16_);
  auVar53 = vmulps_avx512vl(auVar50,auVar104._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar104._0_16_);
  auVar54 = vpxord_avx512vl(auVar257._0_16_,auVar257._0_16_);
  auVar54 = vfmadd213ps_avx512vl(auVar54,auVar52,auVar53);
  auVar54 = vaddps_avx512vl(auVar49,auVar54);
  auVar37 = auVar262._0_16_;
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar37);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar49,auVar37);
  auVar55 = vmulps_avx512vl(auVar41,auVar104._0_16_);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar39,auVar104._0_16_);
  auVar56 = vxorps_avx512vl(auVar56,auVar56);
  auVar56 = vfmadd213ps_avx512vl(auVar56,auVar40,auVar55);
  auVar34 = vaddps_avx512vl(auVar58,auVar56);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar40,auVar37);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar58,auVar37);
  auVar56 = vxorps_avx512vl(auVar56,auVar56);
  auVar56 = vfmadd213ps_avx512vl(auVar56,auVar57,auVar50);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar104._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar104._0_16_);
  auVar50 = vmulps_avx512vl(auVar50,auVar37);
  auVar57 = vfnmadd231ps_avx512vl(auVar50,auVar37,auVar57);
  auVar52 = vfmadd231ps_avx512vl(auVar57,auVar104._0_16_,auVar52);
  auVar35 = vfnmadd231ps_avx512vl(auVar52,auVar104._0_16_,auVar49);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar41);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar40,auVar104._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar49,auVar58,auVar104._0_16_);
  auVar49 = vmulps_avx512vl(auVar41,auVar37);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar37,auVar39);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar104._0_16_,auVar40);
  auVar40 = vfnmadd231ps_avx512vl(auVar49,auVar104._0_16_,auVar58);
  auVar49 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar52 = vshufps_avx512vl(auVar34,auVar34,0xc9);
  fVar119 = auVar53._0_4_;
  auVar144._0_4_ = fVar119 * auVar52._0_4_;
  fVar131 = auVar53._4_4_;
  auVar144._4_4_ = fVar131 * auVar52._4_4_;
  fVar132 = auVar53._8_4_;
  auVar144._8_4_ = fVar132 * auVar52._8_4_;
  fVar133 = auVar53._12_4_;
  auVar144._12_4_ = fVar133 * auVar52._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar144,auVar49,auVar34);
  auVar57 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar160._0_4_ = fVar119 * auVar52._0_4_;
  auVar160._4_4_ = fVar131 * auVar52._4_4_;
  auVar160._8_4_ = fVar132 * auVar52._8_4_;
  auVar160._12_4_ = fVar133 * auVar52._12_4_;
  auVar49 = vfmsub231ps_avx512vl(auVar160,auVar49,auVar55);
  auVar50 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar52 = vshufps_avx(auVar36,auVar36,0xc9);
  fVar143 = auVar35._0_4_;
  auVar181._0_4_ = auVar52._0_4_ * fVar143;
  fVar223 = auVar35._4_4_;
  auVar181._4_4_ = auVar52._4_4_ * fVar223;
  fVar208 = auVar35._8_4_;
  auVar181._8_4_ = auVar52._8_4_ * fVar208;
  fVar218 = auVar35._12_4_;
  auVar181._12_4_ = auVar52._12_4_ * fVar218;
  auVar52 = vfmsub231ps_fma(auVar181,auVar49,auVar36);
  auVar58 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar182._0_4_ = auVar52._0_4_ * fVar143;
  auVar182._4_4_ = auVar52._4_4_ * fVar223;
  auVar182._8_4_ = auVar52._8_4_ * fVar208;
  auVar182._12_4_ = auVar52._12_4_ * fVar218;
  auVar49 = vfmsub231ps_fma(auVar182,auVar49,auVar40);
  auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar104._16_48_ = auVar247;
  auVar257._4_60_ = auVar104._4_60_;
  auVar257._0_4_ = auVar49._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar104._0_16_,auVar257._0_16_);
  auVar39 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  auVar41 = vmulss_avx512f(auVar41,auVar52);
  auVar52 = vmulss_avx512f(auVar41,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  auVar52 = vsubss_avx512f(auVar39,auVar52);
  auVar190._0_4_ = auVar52._0_4_;
  auVar190._4_4_ = auVar190._0_4_;
  auVar190._8_4_ = auVar190._0_4_;
  auVar190._12_4_ = auVar190._0_4_;
  auVar39 = vmulps_avx512vl(auVar57,auVar190);
  auVar52 = vdpps_avx(auVar57,auVar50,0x7f);
  auVar41 = vbroadcastss_avx512vl(auVar49);
  auVar50 = vmulps_avx512vl(auVar41,auVar50);
  fVar219 = auVar52._0_4_;
  auVar145._0_4_ = fVar219 * auVar57._0_4_;
  auVar145._4_4_ = fVar219 * auVar57._4_4_;
  auVar145._8_4_ = fVar219 * auVar57._8_4_;
  auVar145._12_4_ = fVar219 * auVar57._12_4_;
  auVar57 = vsubps_avx(auVar50,auVar145);
  auVar52 = vrcp14ss_avx512f(auVar104._0_16_,auVar257._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar52,ZEXT416(0x40000000));
  fVar219 = auVar52._0_4_ * auVar49._0_4_;
  auVar49 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar260._16_48_ = auVar247;
  auVar260._0_16_ = auVar104._0_16_;
  auVar262._4_60_ = auVar260._4_60_;
  auVar262._0_4_ = auVar49._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar104._0_16_,auVar262._0_16_);
  auVar50 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  fVar134 = auVar52._0_4_;
  fVar142 = auVar50._0_4_ - auVar41._0_4_ * fVar134 * fVar134 * fVar134;
  auVar191._0_4_ = fVar142 * auVar58._0_4_;
  auVar191._4_4_ = fVar142 * auVar58._4_4_;
  auVar191._8_4_ = fVar142 * auVar58._8_4_;
  auVar191._12_4_ = fVar142 * auVar58._12_4_;
  auVar52 = vdpps_avx(auVar58,auVar40,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar49);
  auVar50 = vmulps_avx512vl(auVar50,auVar40);
  fVar134 = auVar52._0_4_;
  auVar36._0_4_ = fVar134 * auVar58._0_4_;
  auVar36._4_4_ = fVar134 * auVar58._4_4_;
  auVar36._8_4_ = fVar134 * auVar58._8_4_;
  auVar36._12_4_ = fVar134 * auVar58._12_4_;
  auVar52 = vsubps_avx(auVar50,auVar36);
  auVar50 = vrcp14ss_avx512f(auVar104._0_16_,auVar262._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar50,ZEXT416(0x40000000));
  fVar134 = auVar50._0_4_ * auVar49._0_4_;
  auVar50 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar58 = vmulps_avx512vl(auVar50,auVar39);
  auVar40 = vsubps_avx512vl(auVar54,auVar58);
  auVar49 = vshufps_avx(auVar53,auVar53,0xff);
  auVar49 = vmulps_avx512vl(auVar49,auVar39);
  auVar136._0_4_ = auVar49._0_4_ + auVar50._0_4_ * auVar190._0_4_ * fVar219 * auVar57._0_4_;
  auVar136._4_4_ = auVar49._4_4_ + auVar50._4_4_ * auVar190._0_4_ * fVar219 * auVar57._4_4_;
  auVar136._8_4_ = auVar49._8_4_ + auVar50._8_4_ * auVar190._0_4_ * fVar219 * auVar57._8_4_;
  auVar136._12_4_ = auVar49._12_4_ + auVar50._12_4_ * auVar190._0_4_ * fVar219 * auVar57._12_4_;
  auVar49 = vsubps_avx(auVar53,auVar136);
  auVar39 = vaddps_avx512vl(auVar54,auVar58);
  auVar57 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar227._0_4_ = auVar191._0_4_ * auVar57._0_4_;
  auVar227._4_4_ = auVar191._4_4_ * auVar57._4_4_;
  auVar227._8_4_ = auVar191._8_4_ * auVar57._8_4_;
  auVar227._12_4_ = auVar191._12_4_ * auVar57._12_4_;
  auVar41 = vsubps_avx512vl(auVar56,auVar227);
  auVar50 = vshufps_avx512vl(auVar35,auVar35,0xff);
  auVar58 = vmulps_avx512vl(auVar50,auVar191);
  auVar146._0_4_ = auVar58._0_4_ + auVar57._0_4_ * fVar142 * auVar52._0_4_ * fVar134;
  auVar146._4_4_ = auVar58._4_4_ + auVar57._4_4_ * fVar142 * auVar52._4_4_ * fVar134;
  auVar146._8_4_ = auVar58._8_4_ + auVar57._8_4_ * fVar142 * auVar52._8_4_ * fVar134;
  auVar146._12_4_ = auVar58._12_4_ + auVar57._12_4_ * fVar142 * auVar52._12_4_ * fVar134;
  auVar52 = vsubps_avx(auVar35,auVar146);
  auVar53 = vaddps_avx512vl(auVar56,auVar227);
  auVar171._0_4_ = auVar40._0_4_ + auVar49._0_4_ * 0.33333334;
  auVar171._4_4_ = auVar40._4_4_ + auVar49._4_4_ * 0.33333334;
  auVar171._8_4_ = auVar40._8_4_ + auVar49._8_4_ * 0.33333334;
  auVar171._12_4_ = auVar40._12_4_ + auVar49._12_4_ * 0.33333334;
  auVar147._0_4_ = auVar52._0_4_ * 0.33333334;
  auVar147._4_4_ = auVar52._4_4_ * 0.33333334;
  auVar147._8_4_ = auVar52._8_4_ * 0.33333334;
  auVar147._12_4_ = auVar52._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar41,auVar147);
  auVar148._0_4_ = (fVar119 + auVar136._0_4_) * 0.33333334;
  auVar148._4_4_ = (fVar131 + auVar136._4_4_) * 0.33333334;
  auVar148._8_4_ = (fVar132 + auVar136._8_4_) * 0.33333334;
  auVar148._12_4_ = (fVar133 + auVar136._12_4_) * 0.33333334;
  auVar54 = vaddps_avx512vl(auVar39,auVar148);
  auVar161._0_4_ = (fVar143 + auVar146._0_4_) * 0.33333334;
  auVar161._4_4_ = (fVar223 + auVar146._4_4_) * 0.33333334;
  auVar161._8_4_ = (fVar208 + auVar146._8_4_) * 0.33333334;
  auVar161._12_4_ = (fVar218 + auVar146._12_4_) * 0.33333334;
  auVar55 = vsubps_avx512vl(auVar53,auVar161);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar52 = vmulps_avx512vl(auVar45,auVar104._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar44,auVar104._0_16_);
  auVar57 = vxorps_avx512vl(auVar50,auVar50);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar43,auVar52);
  auVar34 = vaddps_avx512vl(auVar42,auVar57);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar43,auVar37);
  auVar35 = vfnmadd231ps_avx512vl(auVar52,auVar42,auVar37);
  auVar52 = vmulps_avx512vl(auVar49,auVar104._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar104._0_16_);
  auVar57 = vxorps_avx512vl(auVar56,auVar56);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar47,auVar52);
  auVar50 = vaddps_avx512vl(auVar46,auVar57);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar47,auVar37);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar46,auVar37);
  auVar57 = vxorps_avx512vl(auVar57,auVar57);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar44,auVar45);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar43,auVar104._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar57,auVar42,auVar104._0_16_);
  auVar57 = vmulps_avx512vl(auVar45,auVar37);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar37,auVar44);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar104._0_16_,auVar43);
  auVar42 = vfnmadd231ps_avx512vl(auVar57,auVar104._0_16_,auVar42);
  auVar57 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar48,auVar49);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar104._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar57,auVar46,auVar104._0_16_);
  auVar49 = vmulps_avx512vl(auVar49,auVar37);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar37,auVar48);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar104._0_16_,auVar47);
  auVar44 = vfnmadd231ps_avx512vl(auVar49,auVar104._0_16_,auVar46);
  auVar49 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar57 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  fVar208 = auVar35._0_4_;
  auVar241._0_4_ = fVar208 * auVar57._0_4_;
  fVar218 = auVar35._4_4_;
  auVar241._4_4_ = fVar218 * auVar57._4_4_;
  fVar219 = auVar35._8_4_;
  auVar241._8_4_ = fVar219 * auVar57._8_4_;
  fVar134 = auVar35._12_4_;
  auVar241._12_4_ = fVar134 * auVar57._12_4_;
  auVar57 = vfmsub231ps_avx512vl(auVar241,auVar49,auVar50);
  auVar57 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar50 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar249._0_4_ = fVar208 * auVar50._0_4_;
  auVar249._4_4_ = fVar218 * auVar50._4_4_;
  auVar249._8_4_ = fVar219 * auVar50._8_4_;
  auVar249._12_4_ = fVar134 * auVar50._12_4_;
  auVar49 = vfmsub231ps_avx512vl(auVar249,auVar49,auVar52);
  auVar50 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar52 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar49 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar49 = vmulps_avx512vl(auVar42,auVar49);
  auVar49 = vfmsub231ps_avx512vl(auVar49,auVar52,auVar43);
  auVar43 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  auVar45 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar49 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar45 = vmulps_avx512vl(auVar42,auVar45);
  auVar52 = vfmsub231ps_avx512vl(auVar45,auVar52,auVar44);
  auVar44 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar258._16_48_ = auVar247;
  auVar258._0_16_ = auVar104._0_16_;
  auVar264._4_60_ = auVar258._4_60_;
  auVar264._0_4_ = auVar49._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar104._0_16_,auVar264._0_16_);
  auVar45 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  auVar46 = vmulss_avx512f(auVar46,auVar52);
  auVar52 = vmulss_avx512f(auVar52,auVar52);
  auVar52 = vmulss_avx512f(auVar46,auVar52);
  auVar52 = vsubss_avx512f(auVar45,auVar52);
  auVar45 = vbroadcastss_avx512vl(auVar52);
  auVar46 = vmulps_avx512vl(auVar57,auVar45);
  auVar52 = vdpps_avx(auVar57,auVar50,0x7f);
  auVar47 = vbroadcastss_avx512vl(auVar49);
  auVar50 = vmulps_avx512vl(auVar47,auVar50);
  fVar143 = auVar52._0_4_;
  auVar149._0_4_ = auVar57._0_4_ * fVar143;
  auVar149._4_4_ = auVar57._4_4_ * fVar143;
  auVar149._8_4_ = auVar57._8_4_ * fVar143;
  auVar149._12_4_ = auVar57._12_4_ * fVar143;
  auVar52 = vsubps_avx(auVar50,auVar149);
  auVar57 = vrcp14ss_avx512f(auVar104._0_16_,auVar264._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar57,ZEXT416(0x40000000));
  fVar143 = auVar57._0_4_ * auVar49._0_4_;
  auVar49 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar106._0_4_ = fVar143 * auVar52._0_4_;
  auVar106._4_4_ = fVar143 * auVar52._4_4_;
  auVar106._8_4_ = fVar143 * auVar52._8_4_;
  auVar106._12_4_ = fVar143 * auVar52._12_4_;
  auVar57 = vmulps_avx512vl(auVar45,auVar106);
  auVar261._16_48_ = auVar247;
  auVar261._0_16_ = auVar104._0_16_;
  auVar259._4_60_ = auVar261._4_60_;
  auVar259._0_4_ = auVar49._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar104._0_16_,auVar259._0_16_);
  auVar50 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar45 = vmulss_avx512f(auVar45,auVar52);
  auVar52 = vmulss_avx512f(auVar45,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  fVar223 = auVar50._0_4_ - auVar52._0_4_;
  auVar250._0_4_ = auVar43._0_4_ * fVar223;
  auVar250._4_4_ = auVar43._4_4_ * fVar223;
  auVar250._8_4_ = auVar43._8_4_ * fVar223;
  auVar250._12_4_ = auVar43._12_4_ * fVar223;
  auVar52 = vdpps_avx(auVar43,auVar44,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar49);
  auVar50 = vmulps_avx512vl(auVar50,auVar44);
  fVar143 = auVar52._0_4_;
  auVar162._0_4_ = auVar43._0_4_ * fVar143;
  auVar162._4_4_ = auVar43._4_4_ * fVar143;
  auVar162._8_4_ = auVar43._8_4_ * fVar143;
  auVar162._12_4_ = auVar43._12_4_ * fVar143;
  auVar52 = vsubps_avx(auVar50,auVar162);
  auVar50 = vrcp14ss_avx512f(auVar104._0_16_,auVar259._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar50,ZEXT416(0x40000000));
  auVar264 = ZEXT464(0x3f800000);
  fVar143 = auVar49._0_4_ * auVar50._0_4_;
  auVar50 = vshufps_avx512vl(auVar34,auVar34,0xff);
  auVar43 = vmulps_avx512vl(auVar50,auVar46);
  auVar44 = vsubps_avx512vl(auVar34,auVar43);
  auVar49 = vshufps_avx(auVar35,auVar35,0xff);
  auVar49 = vmulps_avx512vl(auVar49,auVar46);
  auVar107._0_4_ = auVar49._0_4_ + auVar50._0_4_ * auVar57._0_4_;
  auVar107._4_4_ = auVar49._4_4_ + auVar50._4_4_ * auVar57._4_4_;
  auVar107._8_4_ = auVar49._8_4_ + auVar50._8_4_ * auVar57._8_4_;
  auVar107._12_4_ = auVar49._12_4_ + auVar50._12_4_ * auVar57._12_4_;
  auVar49 = vsubps_avx(auVar35,auVar107);
  auVar57 = vaddps_avx512vl(auVar34,auVar43);
  auVar50 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar228._0_4_ = auVar50._0_4_ * auVar250._0_4_;
  auVar228._4_4_ = auVar50._4_4_ * auVar250._4_4_;
  auVar228._8_4_ = auVar50._8_4_ * auVar250._8_4_;
  auVar228._12_4_ = auVar50._12_4_ * auVar250._12_4_;
  auVar43 = vsubps_avx512vl(auVar56,auVar228);
  auVar45 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar250);
  auVar150._0_4_ = auVar45._0_4_ + auVar50._0_4_ * fVar223 * auVar52._0_4_ * fVar143;
  auVar150._4_4_ = auVar45._4_4_ + auVar50._4_4_ * fVar223 * auVar52._4_4_ * fVar143;
  auVar150._8_4_ = auVar45._8_4_ + auVar50._8_4_ * fVar223 * auVar52._8_4_ * fVar143;
  auVar150._12_4_ = auVar45._12_4_ + auVar50._12_4_ * fVar223 * auVar52._12_4_ * fVar143;
  auVar52 = vsubps_avx(auVar42,auVar150);
  auVar50 = vaddps_avx512vl(auVar56,auVar228);
  auVar163._0_4_ = auVar44._0_4_ + auVar49._0_4_ * 0.33333334;
  auVar163._4_4_ = auVar44._4_4_ + auVar49._4_4_ * 0.33333334;
  auVar163._8_4_ = auVar44._8_4_ + auVar49._8_4_ * 0.33333334;
  auVar163._12_4_ = auVar44._12_4_ + auVar49._12_4_ * 0.33333334;
  auVar192._0_4_ = auVar52._0_4_ * 0.33333334;
  auVar192._4_4_ = auVar52._4_4_ * 0.33333334;
  auVar192._8_4_ = auVar52._8_4_ * 0.33333334;
  auVar192._12_4_ = auVar52._12_4_ * 0.33333334;
  auVar49 = vsubps_avx(auVar43,auVar192);
  auVar108._0_4_ = auVar57._0_4_ + (fVar208 + auVar107._0_4_) * 0.33333334;
  auVar108._4_4_ = auVar57._4_4_ + (fVar218 + auVar107._4_4_) * 0.33333334;
  auVar108._8_4_ = auVar57._8_4_ + (fVar219 + auVar107._8_4_) * 0.33333334;
  auVar108._12_4_ = auVar57._12_4_ + (fVar134 + auVar107._12_4_) * 0.33333334;
  auVar151._0_4_ = (auVar42._0_4_ + auVar150._0_4_) * 0.33333334;
  auVar151._4_4_ = (auVar42._4_4_ + auVar150._4_4_) * 0.33333334;
  auVar151._8_4_ = (auVar42._8_4_ + auVar150._8_4_) * 0.33333334;
  auVar151._12_4_ = (auVar42._12_4_ + auVar150._12_4_) * 0.33333334;
  auVar52 = vsubps_avx(auVar50,auVar151);
  auVar42 = vbroadcastss_avx512vl(auVar51);
  auVar45 = vsubss_avx512f(ZEXT416(0x3f800000),auVar51);
  auVar251._0_4_ = auVar45._0_4_;
  auVar251._4_4_ = auVar251._0_4_;
  auVar251._8_4_ = auVar251._0_4_;
  auVar251._12_4_ = auVar251._0_4_;
  auVar44 = vmulps_avx512vl(auVar42,auVar44);
  auVar45 = vmulps_avx512vl(auVar42,auVar163);
  auVar49 = vmulps_avx512vl(auVar42,auVar49);
  auVar242._0_4_ = auVar42._0_4_ * auVar43._0_4_;
  auVar242._4_4_ = auVar42._4_4_ * auVar43._4_4_;
  auVar242._8_4_ = auVar42._8_4_ * auVar43._8_4_;
  auVar242._12_4_ = auVar42._12_4_ * auVar43._12_4_;
  local_540 = vfmadd231ps_avx512vl(auVar44,auVar251,auVar40);
  local_550 = vfmadd231ps_avx512vl(auVar45,auVar251,auVar171);
  local_560 = vfmadd231ps_avx512vl(auVar49,auVar251,auVar58);
  local_570 = vfmadd231ps_fma(auVar242,auVar251,auVar41);
  auVar49 = vmulps_avx512vl(auVar42,auVar57);
  auVar57 = vmulps_avx512vl(auVar42,auVar108);
  auVar52 = vmulps_avx512vl(auVar42,auVar52);
  auVar237._0_4_ = auVar42._0_4_ * auVar50._0_4_;
  auVar237._4_4_ = auVar42._4_4_ * auVar50._4_4_;
  auVar237._8_4_ = auVar42._8_4_ * auVar50._8_4_;
  auVar237._12_4_ = auVar42._12_4_ * auVar50._12_4_;
  _local_580 = vfmadd231ps_avx512vl(auVar49,auVar251,auVar39);
  _local_590 = vfmadd231ps_avx512vl(auVar57,auVar251,auVar54);
  _local_5a0 = vfmadd231ps_avx512vl(auVar52,auVar251,auVar55);
  _local_5b0 = vfmadd231ps_fma(auVar237,auVar251,auVar53);
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_4c0 = vsubps_avx512vl(local_540,auVar49);
  uVar98 = local_4c0._0_4_;
  auVar109._4_4_ = uVar98;
  auVar109._0_4_ = uVar98;
  auVar109._8_4_ = uVar98;
  auVar109._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar57 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar143 = pre->ray_space[k].vz.field_0.m128[0];
  fVar223 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar218 = pre->ray_space[k].vz.field_0.m128[3];
  auVar99._0_4_ = fVar143 * auVar57._0_4_;
  auVar99._4_4_ = fVar223 * auVar57._4_4_;
  auVar99._8_4_ = fVar208 * auVar57._8_4_;
  auVar99._12_4_ = fVar218 * auVar57._12_4_;
  auVar52 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar5,auVar52);
  auVar39 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar109);
  local_4d0 = vsubps_avx512vl(local_550,auVar49);
  uVar98 = local_4d0._0_4_;
  auVar120._4_4_ = uVar98;
  auVar120._0_4_ = uVar98;
  auVar120._8_4_ = uVar98;
  auVar120._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar57 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar110._0_4_ = fVar143 * auVar57._0_4_;
  auVar110._4_4_ = fVar223 * auVar57._4_4_;
  auVar110._8_4_ = fVar208 * auVar57._8_4_;
  auVar110._12_4_ = fVar218 * auVar57._12_4_;
  auVar52 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar52);
  auVar41 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar120);
  local_4e0 = vsubps_avx512vl(local_560,auVar49);
  uVar98 = local_4e0._0_4_;
  auVar121._4_4_ = uVar98;
  auVar121._0_4_ = uVar98;
  auVar121._8_4_ = uVar98;
  auVar121._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar57 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar183._0_4_ = auVar57._0_4_ * fVar143;
  auVar183._4_4_ = auVar57._4_4_ * fVar223;
  auVar183._8_4_ = auVar57._8_4_ * fVar208;
  auVar183._12_4_ = auVar57._12_4_ * fVar218;
  auVar52 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar52);
  auVar42 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar121);
  local_4f0 = vsubps_avx(local_570,auVar49);
  uVar98 = local_4f0._0_4_;
  auVar122._4_4_ = uVar98;
  auVar122._0_4_ = uVar98;
  auVar122._8_4_ = uVar98;
  auVar122._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar57 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar193._0_4_ = auVar57._0_4_ * fVar143;
  auVar193._4_4_ = auVar57._4_4_ * fVar223;
  auVar193._8_4_ = auVar57._8_4_ * fVar208;
  auVar193._12_4_ = auVar57._12_4_ * fVar218;
  auVar52 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar5,auVar52);
  auVar43 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar122);
  local_500 = vsubps_avx512vl(_local_580,auVar49);
  uVar98 = local_500._0_4_;
  auVar123._4_4_ = uVar98;
  auVar123._0_4_ = uVar98;
  auVar123._8_4_ = uVar98;
  auVar123._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_500,local_500,0x55);
  auVar57 = vshufps_avx(local_500,local_500,0xaa);
  auVar204._0_4_ = auVar57._0_4_ * fVar143;
  auVar204._4_4_ = auVar57._4_4_ * fVar223;
  auVar204._8_4_ = auVar57._8_4_ * fVar208;
  auVar204._12_4_ = auVar57._12_4_ * fVar218;
  auVar52 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar52);
  auVar44 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar123);
  local_510 = vsubps_avx512vl(_local_590,auVar49);
  uVar98 = local_510._0_4_;
  auVar124._4_4_ = uVar98;
  auVar124._0_4_ = uVar98;
  auVar124._8_4_ = uVar98;
  auVar124._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_510,local_510,0x55);
  auVar57 = vshufps_avx(local_510,local_510,0xaa);
  auVar209._0_4_ = auVar57._0_4_ * fVar143;
  auVar209._4_4_ = auVar57._4_4_ * fVar223;
  auVar209._8_4_ = auVar57._8_4_ * fVar208;
  auVar209._12_4_ = auVar57._12_4_ * fVar218;
  auVar52 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar52);
  auVar45 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar124);
  local_520 = vsubps_avx512vl(_local_5a0,auVar49);
  uVar98 = local_520._0_4_;
  auVar125._4_4_ = uVar98;
  auVar125._0_4_ = uVar98;
  auVar125._8_4_ = uVar98;
  auVar125._12_4_ = uVar98;
  auVar52 = vshufps_avx(local_520,local_520,0x55);
  auVar57 = vshufps_avx(local_520,local_520,0xaa);
  auVar229._0_4_ = auVar57._0_4_ * fVar143;
  auVar229._4_4_ = auVar57._4_4_ * fVar223;
  auVar229._8_4_ = auVar57._8_4_ * fVar208;
  auVar229._12_4_ = auVar57._12_4_ * fVar218;
  auVar52 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar52);
  auVar46 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar125);
  local_530 = vsubps_avx(_local_5b0,auVar49);
  uVar98 = local_530._0_4_;
  auVar112._4_4_ = uVar98;
  auVar112._0_4_ = uVar98;
  auVar112._8_4_ = uVar98;
  auVar112._12_4_ = uVar98;
  auVar49 = vshufps_avx(local_530,local_530,0x55);
  auVar52 = vshufps_avx(local_530,local_530,0xaa);
  auVar164._0_4_ = fVar143 * auVar52._0_4_;
  auVar164._4_4_ = fVar223 * auVar52._4_4_;
  auVar164._8_4_ = fVar208 * auVar52._8_4_;
  auVar164._12_4_ = fVar218 * auVar52._12_4_;
  auVar49 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar49);
  auVar47 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar4,auVar112);
  auVar57 = vmovlhps_avx(auVar39,auVar44);
  auVar50 = vmovlhps_avx(auVar41,auVar45);
  auVar58 = vmovlhps_avx(auVar42,auVar46);
  _local_4a0 = vmovlhps_avx512f(auVar43,auVar47);
  auVar52 = vminps_avx(auVar57,auVar50);
  auVar49 = vmaxps_avx(auVar57,auVar50);
  auVar40 = vminps_avx512vl(auVar58,_local_4a0);
  auVar52 = vminps_avx(auVar52,auVar40);
  auVar40 = vmaxps_avx512vl(auVar58,_local_4a0);
  auVar49 = vmaxps_avx(auVar49,auVar40);
  auVar40 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vminps_avx(auVar52,auVar40);
  auVar40 = vshufpd_avx(auVar49,auVar49,3);
  auVar49 = vmaxps_avx(auVar49,auVar40);
  auVar52 = vandps_avx512vl(auVar52,auVar263._0_16_);
  auVar49 = vandps_avx512vl(auVar49,auVar263._0_16_);
  auVar49 = vmaxps_avx(auVar52,auVar49);
  auVar52 = vmovshdup_avx(auVar49);
  auVar49 = vmaxss_avx(auVar52,auVar49);
  auVar52 = vmovddup_avx512vl(auVar39);
  auVar40 = vmovddup_avx512vl(auVar41);
  auVar184._0_8_ = auVar42._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar194._0_8_ = auVar43._0_8_;
  auVar194._8_8_ = auVar194._0_8_;
  local_4b0 = ZEXT416((uint)(auVar49._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar49 = vxorps_avx512vl(local_440._0_16_,auVar48);
  local_460 = vbroadcastss_avx512vl(auVar49);
  bVar29 = false;
  uVar22 = 0;
  fVar143 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx(auVar50,auVar57);
  local_480 = vsubps_avx(auVar58,auVar50);
  local_490 = vsubps_avx512vl(_local_4a0,auVar58);
  local_5d0 = vsubps_avx512vl(_local_580,local_540);
  local_5e0 = vsubps_avx512vl(_local_590,local_550);
  local_5f0 = vsubps_avx512vl(_local_5a0,local_560);
  _local_600 = vsubps_avx(_local_5b0,local_570);
  auVar104 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar104);
  auVar49 = ZEXT816(0x3f80000000000000);
  auVar95._32_32_ = auVar104._32_32_;
  auVar35 = auVar49;
LAB_018c7e64:
  auVar39 = vshufps_avx(auVar35,auVar35,0x50);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = 0x3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar82._16_4_ = 0x3f800000;
  auVar82._0_16_ = auVar243;
  auVar82._20_4_ = 0x3f800000;
  auVar82._24_4_ = 0x3f800000;
  auVar82._28_4_ = 0x3f800000;
  auVar41 = vsubps_avx(auVar243,auVar39);
  fVar223 = auVar39._0_4_;
  fVar134 = auVar44._0_4_;
  auVar137._0_4_ = fVar134 * fVar223;
  fVar208 = auVar39._4_4_;
  fVar142 = auVar44._4_4_;
  auVar137._4_4_ = fVar142 * fVar208;
  fVar218 = auVar39._8_4_;
  auVar137._8_4_ = fVar134 * fVar218;
  fVar219 = auVar39._12_4_;
  auVar137._12_4_ = fVar142 * fVar219;
  fVar119 = auVar45._0_4_;
  auVar152._0_4_ = fVar119 * fVar223;
  fVar131 = auVar45._4_4_;
  auVar152._4_4_ = fVar131 * fVar208;
  auVar152._8_4_ = fVar119 * fVar218;
  auVar152._12_4_ = fVar131 * fVar219;
  fVar132 = auVar46._0_4_;
  auVar165._0_4_ = fVar132 * fVar223;
  fVar133 = auVar46._4_4_;
  auVar165._4_4_ = fVar133 * fVar208;
  auVar165._8_4_ = fVar132 * fVar218;
  auVar165._12_4_ = fVar133 * fVar219;
  fVar224 = auVar47._0_4_;
  auVar113._0_4_ = fVar224 * fVar223;
  fVar236 = auVar47._4_4_;
  auVar113._4_4_ = fVar236 * fVar208;
  auVar113._8_4_ = fVar224 * fVar218;
  auVar113._12_4_ = fVar236 * fVar219;
  auVar43 = vfmadd231ps_avx512vl(auVar137,auVar41,auVar52);
  auVar48 = vfmadd231ps_avx512vl(auVar152,auVar41,auVar40);
  auVar42 = vfmadd231ps_fma(auVar165,auVar41,auVar184);
  auVar41 = vfmadd231ps_fma(auVar113,auVar194,auVar41);
  auVar39 = vmovshdup_avx(auVar49);
  fVar208 = auVar49._0_4_;
  fVar223 = (auVar39._0_4_ - fVar208) * 0.04761905;
  auVar76._4_4_ = fVar208;
  auVar76._0_4_ = fVar208;
  auVar76._8_4_ = fVar208;
  auVar76._12_4_ = fVar208;
  auVar76._16_4_ = fVar208;
  auVar76._20_4_ = fVar208;
  auVar76._24_4_ = fVar208;
  auVar76._28_4_ = fVar208;
  auVar65._0_8_ = auVar39._0_8_;
  auVar65._8_8_ = auVar65._0_8_;
  auVar65._16_8_ = auVar65._0_8_;
  auVar65._24_8_ = auVar65._0_8_;
  auVar79 = vsubps_avx(auVar65,auVar76);
  uVar98 = auVar43._0_4_;
  auVar80._4_4_ = uVar98;
  auVar80._0_4_ = uVar98;
  auVar80._8_4_ = uVar98;
  auVar80._12_4_ = uVar98;
  auVar80._16_4_ = uVar98;
  auVar80._20_4_ = uVar98;
  auVar80._24_4_ = uVar98;
  auVar80._28_4_ = uVar98;
  auVar68._8_4_ = 1;
  auVar68._0_8_ = 0x100000001;
  auVar68._12_4_ = 1;
  auVar68._16_4_ = 1;
  auVar68._20_4_ = 1;
  auVar68._24_4_ = 1;
  auVar68._28_4_ = 1;
  auVar78 = ZEXT1632(auVar43);
  auVar77 = vpermps_avx2(auVar68,auVar78);
  auVar62 = vbroadcastss_avx512vl(auVar48);
  auVar72 = ZEXT1632(auVar48);
  auVar63 = vpermps_avx512vl(auVar68,auVar72);
  auVar64 = vbroadcastss_avx512vl(auVar42);
  auVar73 = ZEXT1632(auVar42);
  auVar65 = vpermps_avx512vl(auVar68,auVar73);
  auVar66 = vbroadcastss_avx512vl(auVar41);
  auVar75 = ZEXT1632(auVar41);
  auVar67 = vpermps_avx512vl(auVar68,auVar75);
  auVar81._4_4_ = fVar223;
  auVar81._0_4_ = fVar223;
  auVar81._8_4_ = fVar223;
  auVar81._12_4_ = fVar223;
  auVar81._16_4_ = fVar223;
  auVar81._20_4_ = fVar223;
  auVar81._24_4_ = fVar223;
  auVar81._28_4_ = fVar223;
  auVar74._8_4_ = 2;
  auVar74._0_8_ = 0x200000002;
  auVar74._12_4_ = 2;
  auVar74._16_4_ = 2;
  auVar74._20_4_ = 2;
  auVar74._24_4_ = 2;
  auVar74._28_4_ = 2;
  auVar68 = vpermps_avx512vl(auVar74,auVar78);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar70 = vpermps_avx512vl(auVar69,auVar78);
  auVar71 = vpermps_avx512vl(auVar74,auVar72);
  auVar72 = vpermps_avx512vl(auVar69,auVar72);
  auVar78 = vpermps_avx2(auVar74,auVar73);
  auVar73 = vpermps_avx512vl(auVar69,auVar73);
  auVar74 = vpermps_avx512vl(auVar74,auVar75);
  auVar69 = vpermps_avx512vl(auVar69,auVar75);
  auVar39 = vfmadd132ps_fma(auVar79,auVar76,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar82,ZEXT1632(auVar39));
  auVar75 = vmulps_avx512vl(auVar62,ZEXT1632(auVar39));
  auVar82 = ZEXT1632(auVar39);
  auVar76 = vmulps_avx512vl(auVar63,auVar82);
  auVar41 = vfmadd231ps_fma(auVar75,auVar79,auVar80);
  auVar42 = vfmadd231ps_fma(auVar76,auVar79,auVar77);
  auVar75 = vmulps_avx512vl(auVar64,auVar82);
  auVar76 = vmulps_avx512vl(auVar65,auVar82);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar62);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar63);
  auVar62 = vmulps_avx512vl(auVar66,auVar82);
  auVar80 = ZEXT1632(auVar39);
  auVar63 = vmulps_avx512vl(auVar67,auVar80);
  auVar64 = vfmadd231ps_avx512vl(auVar62,auVar79,auVar64);
  auVar65 = vfmadd231ps_avx512vl(auVar63,auVar79,auVar65);
  fVar218 = auVar39._0_4_;
  fVar219 = auVar39._4_4_;
  auVar62._4_4_ = fVar219 * auVar75._4_4_;
  auVar62._0_4_ = fVar218 * auVar75._0_4_;
  fVar220 = auVar39._8_4_;
  auVar62._8_4_ = fVar220 * auVar75._8_4_;
  fVar221 = auVar39._12_4_;
  auVar62._12_4_ = fVar221 * auVar75._12_4_;
  auVar62._16_4_ = auVar75._16_4_ * 0.0;
  auVar62._20_4_ = auVar75._20_4_ * 0.0;
  auVar62._24_4_ = auVar75._24_4_ * 0.0;
  auVar62._28_4_ = fVar208;
  auVar63._4_4_ = fVar219 * auVar76._4_4_;
  auVar63._0_4_ = fVar218 * auVar76._0_4_;
  auVar63._8_4_ = fVar220 * auVar76._8_4_;
  auVar63._12_4_ = fVar221 * auVar76._12_4_;
  auVar63._16_4_ = auVar76._16_4_ * 0.0;
  auVar63._20_4_ = auVar76._20_4_ * 0.0;
  auVar63._24_4_ = auVar76._24_4_ * 0.0;
  auVar63._28_4_ = auVar77._28_4_;
  auVar41 = vfmadd231ps_fma(auVar62,auVar79,ZEXT1632(auVar41));
  auVar42 = vfmadd231ps_fma(auVar63,auVar79,ZEXT1632(auVar42));
  auVar67._0_4_ = fVar218 * auVar64._0_4_;
  auVar67._4_4_ = fVar219 * auVar64._4_4_;
  auVar67._8_4_ = fVar220 * auVar64._8_4_;
  auVar67._12_4_ = fVar221 * auVar64._12_4_;
  auVar67._16_4_ = auVar64._16_4_ * 0.0;
  auVar67._20_4_ = auVar64._20_4_ * 0.0;
  auVar67._24_4_ = auVar64._24_4_ * 0.0;
  auVar67._28_4_ = 0;
  auVar77._4_4_ = fVar219 * auVar65._4_4_;
  auVar77._0_4_ = fVar218 * auVar65._0_4_;
  auVar77._8_4_ = fVar220 * auVar65._8_4_;
  auVar77._12_4_ = fVar221 * auVar65._12_4_;
  auVar77._16_4_ = auVar65._16_4_ * 0.0;
  auVar77._20_4_ = auVar65._20_4_ * 0.0;
  auVar77._24_4_ = auVar65._24_4_ * 0.0;
  auVar77._28_4_ = auVar64._28_4_;
  auVar43 = vfmadd231ps_fma(auVar67,auVar79,auVar75);
  auVar48 = vfmadd231ps_fma(auVar77,auVar79,auVar76);
  auVar64._28_4_ = auVar76._28_4_;
  auVar64._0_28_ =
       ZEXT1628(CONCAT412(fVar221 * auVar48._12_4_,
                          CONCAT48(fVar220 * auVar48._8_4_,
                                   CONCAT44(fVar219 * auVar48._4_4_,fVar218 * auVar48._0_4_))));
  auVar51 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar221 * auVar43._12_4_,
                                               CONCAT48(fVar220 * auVar43._8_4_,
                                                        CONCAT44(fVar219 * auVar43._4_4_,
                                                                 fVar218 * auVar43._0_4_)))),auVar79
                            ,ZEXT1632(auVar41));
  auVar53 = vfmadd231ps_fma(auVar64,auVar79,ZEXT1632(auVar42));
  auVar77 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar41));
  auVar62 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar42));
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar77 = vmulps_avx512vl(auVar77,auVar63);
  auVar62 = vmulps_avx512vl(auVar62,auVar63);
  auVar75._0_4_ = fVar223 * auVar77._0_4_;
  auVar75._4_4_ = fVar223 * auVar77._4_4_;
  auVar75._8_4_ = fVar223 * auVar77._8_4_;
  auVar75._12_4_ = fVar223 * auVar77._12_4_;
  auVar75._16_4_ = fVar223 * auVar77._16_4_;
  auVar75._20_4_ = fVar223 * auVar77._20_4_;
  auVar75._24_4_ = fVar223 * auVar77._24_4_;
  auVar75._28_4_ = 0;
  auVar77 = vmulps_avx512vl(auVar81,auVar62);
  auVar42 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
  auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar51),_DAT_01fb9fc0,ZEXT1632(auVar42));
  auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_01fb9fc0,ZEXT1632(auVar42));
  auVar118._0_4_ = auVar75._0_4_ + auVar51._0_4_;
  auVar118._4_4_ = auVar75._4_4_ + auVar51._4_4_;
  auVar118._8_4_ = auVar75._8_4_ + auVar51._8_4_;
  auVar118._12_4_ = auVar75._12_4_ + auVar51._12_4_;
  auVar118._16_4_ = auVar75._16_4_ + 0.0;
  auVar118._20_4_ = auVar75._20_4_ + 0.0;
  auVar118._24_4_ = auVar75._24_4_ + 0.0;
  auVar118._28_4_ = 0;
  auVar76 = ZEXT1632(auVar42);
  auVar65 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,auVar76);
  auVar66 = vaddps_avx512vl(ZEXT1632(auVar53),auVar77);
  auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,auVar76);
  auVar77 = vsubps_avx(auVar62,auVar65);
  auVar65 = vsubps_avx512vl(auVar64,auVar67);
  auVar67 = vmulps_avx512vl(auVar71,auVar80);
  auVar75 = vmulps_avx512vl(auVar72,auVar80);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar79,auVar68);
  auVar68 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar70);
  auVar70 = vmulps_avx512vl(auVar78,auVar80);
  auVar75 = vmulps_avx512vl(auVar73,auVar80);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar79,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar72);
  auVar72 = vmulps_avx512vl(auVar74,auVar80);
  auVar69 = vmulps_avx512vl(auVar69,auVar80);
  auVar41 = vfmadd231ps_fma(auVar72,auVar79,auVar78);
  auVar78 = vfmadd231ps_avx512vl(auVar69,auVar79,auVar73);
  auVar69 = vmulps_avx512vl(auVar80,auVar70);
  auVar74 = ZEXT1632(auVar39);
  auVar72 = vmulps_avx512vl(auVar74,auVar71);
  auVar67 = vfmadd231ps_avx512vl(auVar69,auVar79,auVar67);
  auVar68 = vfmadd231ps_avx512vl(auVar72,auVar79,auVar68);
  auVar78 = vmulps_avx512vl(auVar74,auVar78);
  auVar69 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar221 * auVar41._12_4_,
                                          CONCAT48(fVar220 * auVar41._8_4_,
                                                   CONCAT44(fVar219 * auVar41._4_4_,
                                                            fVar218 * auVar41._0_4_)))),auVar79,
                       auVar70);
  auVar70 = vfmadd231ps_avx512vl(auVar78,auVar79,auVar71);
  auVar78._4_4_ = fVar219 * auVar69._4_4_;
  auVar78._0_4_ = fVar218 * auVar69._0_4_;
  auVar78._8_4_ = fVar220 * auVar69._8_4_;
  auVar78._12_4_ = fVar221 * auVar69._12_4_;
  auVar78._16_4_ = auVar69._16_4_ * 0.0;
  auVar78._20_4_ = auVar69._20_4_ * 0.0;
  auVar78._24_4_ = auVar69._24_4_ * 0.0;
  auVar78._28_4_ = auVar73._28_4_;
  auVar71 = vmulps_avx512vl(auVar74,auVar70);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar79,auVar67);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar68,auVar79);
  auVar79 = vsubps_avx512vl(auVar69,auVar67);
  auVar67 = vsubps_avx512vl(auVar70,auVar68);
  auVar68 = vmulps_avx512vl(auVar79,auVar63);
  auVar63 = vmulps_avx512vl(auVar67,auVar63);
  fVar208 = fVar223 * auVar68._0_4_;
  fVar218 = fVar223 * auVar68._4_4_;
  auVar79._4_4_ = fVar218;
  auVar79._0_4_ = fVar208;
  fVar219 = fVar223 * auVar68._8_4_;
  auVar79._8_4_ = fVar219;
  fVar220 = fVar223 * auVar68._12_4_;
  auVar79._12_4_ = fVar220;
  fVar221 = fVar223 * auVar68._16_4_;
  auVar79._16_4_ = fVar221;
  fVar222 = fVar223 * auVar68._20_4_;
  auVar79._20_4_ = fVar222;
  fVar223 = fVar223 * auVar68._24_4_;
  auVar79._24_4_ = fVar223;
  auVar79._28_4_ = auVar68._28_4_;
  auVar63 = vmulps_avx512vl(auVar81,auVar63);
  auVar67 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar76);
  auVar69 = vpermt2ps_avx512vl(auVar71,_DAT_01fb9fc0,auVar76);
  auVar207._0_4_ = auVar78._0_4_ + fVar208;
  auVar207._4_4_ = auVar78._4_4_ + fVar218;
  auVar207._8_4_ = auVar78._8_4_ + fVar219;
  auVar207._12_4_ = auVar78._12_4_ + fVar220;
  auVar207._16_4_ = auVar78._16_4_ + fVar221;
  auVar207._20_4_ = auVar78._20_4_ + fVar222;
  auVar207._24_4_ = auVar78._24_4_ + fVar223;
  auVar207._28_4_ = auVar78._28_4_ + auVar68._28_4_;
  auVar79 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,ZEXT1632(auVar42));
  auVar68 = vaddps_avx512vl(auVar71,auVar63);
  auVar63 = vpermt2ps_avx512vl(auVar63,_DAT_01fb9fc0,ZEXT1632(auVar42));
  auVar79 = vsubps_avx(auVar67,auVar79);
  auVar63 = vsubps_avx512vl(auVar69,auVar63);
  auVar257 = ZEXT3264(auVar63);
  auVar141 = ZEXT1632(auVar51);
  auVar70 = vsubps_avx512vl(auVar78,auVar141);
  auVar159 = ZEXT1632(auVar53);
  auVar72 = vsubps_avx512vl(auVar71,auVar159);
  auVar73 = vsubps_avx512vl(auVar67,auVar62);
  auVar70 = vaddps_avx512vl(auVar70,auVar73);
  auVar73 = vsubps_avx512vl(auVar69,auVar64);
  auVar72 = vaddps_avx512vl(auVar72,auVar73);
  auVar73 = vmulps_avx512vl(auVar159,auVar70);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar141,auVar72);
  auVar74 = vmulps_avx512vl(auVar66,auVar70);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar118,auVar72);
  auVar75 = vmulps_avx512vl(auVar65,auVar70);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar77,auVar72);
  auVar76 = vmulps_avx512vl(auVar64,auVar70);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar62,auVar72);
  auVar80 = vmulps_avx512vl(auVar71,auVar70);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar78,auVar72);
  auVar81 = vmulps_avx512vl(auVar68,auVar70);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar207,auVar72);
  auVar82 = vmulps_avx512vl(auVar63,auVar70);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar79,auVar72);
  auVar70 = vmulps_avx512vl(auVar69,auVar70);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar72);
  auVar72 = vminps_avx512vl(auVar73,auVar74);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar72 = vminps_avx512vl(auVar72,auVar74);
  auVar74 = vmaxps_avx512vl(auVar75,auVar76);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar80,auVar81);
  auVar75 = vmaxps_avx512vl(auVar80,auVar81);
  auVar76 = vminps_avx512vl(auVar82,auVar70);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar72 = vminps_avx512vl(auVar72,auVar74);
  auVar70 = vmaxps_avx512vl(auVar82,auVar70);
  auVar70 = vmaxps_avx512vl(auVar75,auVar70);
  auVar70 = vmaxps_avx512vl(auVar73,auVar70);
  auVar39 = auVar70._0_16_;
  uVar14 = vcmpps_avx512vl(auVar72,local_440,2);
  uVar15 = vcmpps_avx512vl(auVar70,local_460,5);
  bVar20 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar20 != 0) {
    auVar70 = vsubps_avx512vl(auVar62,auVar141);
    auVar72 = vsubps_avx512vl(auVar64,auVar159);
    auVar73 = vsubps_avx512vl(auVar67,auVar78);
    auVar70 = vaddps_avx512vl(auVar70,auVar73);
    auVar39 = auVar70._0_16_;
    auVar73 = vsubps_avx512vl(auVar69,auVar71);
    auVar72 = vaddps_avx512vl(auVar72,auVar73);
    auVar73 = vmulps_avx512vl(auVar159,auVar70);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar141);
    auVar66 = vmulps_avx512vl(auVar66,auVar70);
    auVar66 = vfnmadd213ps_avx512vl(auVar118,auVar72,auVar66);
    auVar65 = vmulps_avx512vl(auVar65,auVar70);
    auVar65 = vfnmadd213ps_avx512vl(auVar77,auVar72,auVar65);
    auVar77 = vmulps_avx512vl(auVar64,auVar70);
    auVar64 = vfnmadd231ps_avx512vl(auVar77,auVar72,auVar62);
    auVar77 = vmulps_avx512vl(auVar71,auVar70);
    auVar71 = vfnmadd231ps_avx512vl(auVar77,auVar72,auVar78);
    auVar77 = vmulps_avx512vl(auVar68,auVar70);
    auVar68 = vfnmadd213ps_avx512vl(auVar207,auVar72,auVar77);
    auVar77 = vmulps_avx512vl(auVar63,auVar70);
    auVar74 = vfnmadd213ps_avx512vl(auVar79,auVar72,auVar77);
    auVar79 = vmulps_avx512vl(auVar69,auVar70);
    auVar67 = vfnmadd231ps_avx512vl(auVar79,auVar67,auVar72);
    auVar77 = vminps_avx(auVar73,auVar66);
    auVar79 = vmaxps_avx(auVar73,auVar66);
    auVar62 = vminps_avx(auVar65,auVar64);
    auVar62 = vminps_avx(auVar77,auVar62);
    auVar77 = vmaxps_avx(auVar65,auVar64);
    auVar79 = vmaxps_avx(auVar79,auVar77);
    auVar78 = vminps_avx(auVar71,auVar68);
    auVar77 = vmaxps_avx(auVar71,auVar68);
    auVar63 = vminps_avx(auVar74,auVar67);
    auVar78 = vminps_avx(auVar78,auVar63);
    auVar78 = vminps_avx(auVar62,auVar78);
    auVar62 = vmaxps_avx(auVar74,auVar67);
    auVar77 = vmaxps_avx(auVar77,auVar62);
    auVar79 = vmaxps_avx(auVar79,auVar77);
    uVar14 = vcmpps_avx512vl(auVar79,local_460,5);
    uVar15 = vcmpps_avx512vl(auVar78,local_440,2);
    bVar20 = bVar20 & (byte)uVar14 & (byte)uVar15;
    if (bVar20 != 0) {
      auStack_640[uVar22] = (uint)bVar20;
      uVar14 = vmovlps_avx(auVar49);
      (&uStack_420)[uVar22] = uVar14;
      uVar3 = vmovlps_avx(auVar35);
      auStack_3a0[uVar22] = uVar3;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
  }
  auVar49 = vxorps_avx512vl(auVar39,auVar39);
  auVar104 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar262 = ZEXT1664(auVar49);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar258 = ZEXT3264(auVar79);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar259 = ZEXT1664(auVar49);
  auVar260 = ZEXT464(0x3e2aaaab);
  auVar265._32_32_ = auVar95._32_32_;
  auVar265._0_32_ = _DAT_01fb9fe0;
  auVar261 = ZEXT3264(_DAT_01fb9fe0);
  auVar96._16_48_ = auVar265._16_48_;
  auVar96._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar265 = ZEXT1664(auVar96._0_16_);
LAB_018c8362:
  do {
    do {
      do {
        auVar39 = auVar104._0_16_;
        if ((int)uVar22 == 0) {
          if (bVar29) goto LAB_018c927b;
          uVar98 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar19._4_4_ = uVar98;
          auVar19._0_4_ = uVar98;
          auVar19._8_4_ = uVar98;
          auVar19._12_4_ = uVar98;
          uVar14 = vcmpps_avx512vl(local_5c0,auVar19,2);
          uVar28 = (ulong)((uint)uVar28 & (uint)uVar28 + 0xf & (uint)uVar14);
          goto LAB_018c7357;
        }
        uVar21 = (int)uVar22 - 1;
        uVar23 = (ulong)uVar21;
        uVar7 = auStack_640[uVar23];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auStack_3a0[uVar23];
        uVar3 = 0;
        for (uVar26 = (ulong)uVar7; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar3 = uVar3 + 1;
        }
        uVar24 = uVar7 - 1 & uVar7;
        bVar32 = uVar24 == 0;
        auStack_640[uVar23] = uVar24;
        if (bVar32) {
          uVar22 = (ulong)uVar21;
        }
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar3;
        auVar49 = vpunpcklqdq_avx(auVar100,ZEXT416((int)uVar3 + 1));
        auVar95._32_32_ = auVar96._32_32_;
        auVar49 = vcvtqq2ps_avx512vl(auVar49);
        auVar49 = vmulps_avx512vl(auVar49,auVar259._0_16_);
        uVar98 = *(undefined4 *)((long)&uStack_420 + uVar23 * 8 + 4);
        auVar16._4_4_ = uVar98;
        auVar16._0_4_ = uVar98;
        auVar16._8_4_ = uVar98;
        auVar16._12_4_ = uVar98;
        auVar41 = vmulps_avx512vl(auVar49,auVar16);
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar49 = vsubps_avx(auVar126,auVar49);
        uVar98 = *(undefined4 *)(&uStack_420 + uVar23);
        auVar17._4_4_ = uVar98;
        auVar17._0_4_ = uVar98;
        auVar17._8_4_ = uVar98;
        auVar17._12_4_ = uVar98;
        auVar49 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar17);
        auVar41 = vmovshdup_avx(auVar49);
        fVar223 = auVar41._0_4_ - auVar49._0_4_;
        auVar41 = vucomiss_avx512f(ZEXT416((uint)fVar223));
        auVar260 = ZEXT1664(auVar41);
        if (uVar7 == 0 || bVar32) goto LAB_018c7e64;
        auVar41 = vshufps_avx(auVar35,auVar35,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar223));
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar42 = vsubps_avx(auVar138,auVar41);
        fVar208 = auVar41._0_4_;
        auVar153._0_4_ = fVar208 * fVar134;
        fVar218 = auVar41._4_4_;
        auVar153._4_4_ = fVar218 * fVar142;
        fVar219 = auVar41._8_4_;
        auVar153._8_4_ = fVar219 * fVar134;
        fVar220 = auVar41._12_4_;
        auVar153._12_4_ = fVar220 * fVar142;
        auVar166._0_4_ = fVar208 * fVar119;
        auVar166._4_4_ = fVar218 * fVar131;
        auVar166._8_4_ = fVar219 * fVar119;
        auVar166._12_4_ = fVar220 * fVar131;
        auVar172._0_4_ = fVar208 * fVar132;
        auVar172._4_4_ = fVar218 * fVar133;
        auVar172._8_4_ = fVar219 * fVar132;
        auVar172._12_4_ = fVar220 * fVar133;
        auVar127._0_4_ = fVar208 * fVar224;
        auVar127._4_4_ = fVar218 * fVar236;
        auVar127._8_4_ = fVar219 * fVar224;
        auVar127._12_4_ = fVar220 * fVar236;
        auVar41 = vfmadd231ps_fma(auVar153,auVar42,auVar52);
        auVar43 = vfmadd231ps_fma(auVar166,auVar42,auVar40);
        auVar48 = vfmadd231ps_fma(auVar172,auVar42,auVar184);
        auVar42 = vfmadd231ps_fma(auVar127,auVar42,auVar194);
        auVar66._16_16_ = auVar41;
        auVar66._0_16_ = auVar41;
        auVar69._16_16_ = auVar43;
        auVar69._0_16_ = auVar43;
        auVar71._16_16_ = auVar48;
        auVar71._0_16_ = auVar48;
        auVar77 = vpermps_avx512vl(auVar261._0_32_,ZEXT1632(auVar49));
        auVar79 = vsubps_avx(auVar69,auVar66);
        auVar43 = vfmadd213ps_fma(auVar79,auVar77,auVar66);
        auVar79 = vsubps_avx(auVar71,auVar69);
        auVar51 = vfmadd213ps_fma(auVar79,auVar77,auVar69);
        auVar41 = vsubps_avx(auVar42,auVar48);
        auVar70._16_16_ = auVar41;
        auVar70._0_16_ = auVar41;
        auVar41 = vfmadd213ps_fma(auVar70,auVar77,auVar71);
        auVar79 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar43));
        auVar42 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar43));
        auVar79 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar51));
        auVar41 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar51));
        auVar79 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar42));
        auVar37 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar79,auVar77);
        auVar95._0_32_ = vmulps_avx512vl(auVar79,auVar258._0_32_);
        auVar96._16_48_ = auVar95._16_48_;
        auVar41 = vmulss_avx512f(ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar208 = auVar41._0_4_;
        auVar173._0_8_ =
             CONCAT44(auVar37._4_4_ + fVar208 * auVar95._4_4_,
                      auVar37._0_4_ + fVar208 * auVar95._0_4_);
        auVar173._8_4_ = auVar37._8_4_ + fVar208 * auVar95._8_4_;
        auVar173._12_4_ = auVar37._12_4_ + fVar208 * auVar95._12_4_;
        auVar154._0_4_ = fVar208 * auVar95._16_4_;
        auVar154._4_4_ = fVar208 * auVar95._20_4_;
        auVar154._8_4_ = fVar208 * auVar95._24_4_;
        auVar154._12_4_ = fVar208 * auVar95._28_4_;
        auVar56 = vsubps_avx((undefined1  [16])0x0,auVar154);
        auVar51 = vshufpd_avx(auVar37,auVar37,3);
        auVar53 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar41 = vsubps_avx(auVar51,auVar37);
        auVar42 = vsubps_avx(auVar53,(undefined1  [16])0x0);
        auVar195._0_4_ = auVar41._0_4_ + auVar42._0_4_;
        auVar195._4_4_ = auVar41._4_4_ + auVar42._4_4_;
        auVar195._8_4_ = auVar41._8_4_ + auVar42._8_4_;
        auVar195._12_4_ = auVar41._12_4_ + auVar42._12_4_;
        auVar41 = vshufps_avx(auVar37,auVar37,0xb1);
        auVar42 = vshufps_avx(auVar173,auVar173,0xb1);
        auVar43 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar244._4_4_ = auVar195._0_4_;
        auVar244._0_4_ = auVar195._0_4_;
        auVar244._8_4_ = auVar195._0_4_;
        auVar244._12_4_ = auVar195._0_4_;
        auVar54 = vshufps_avx(auVar195,auVar195,0x55);
        fVar208 = auVar54._0_4_;
        auVar205._0_4_ = auVar41._0_4_ * fVar208;
        fVar218 = auVar54._4_4_;
        auVar205._4_4_ = auVar41._4_4_ * fVar218;
        fVar219 = auVar54._8_4_;
        auVar205._8_4_ = auVar41._8_4_ * fVar219;
        fVar220 = auVar54._12_4_;
        auVar205._12_4_ = auVar41._12_4_ * fVar220;
        auVar210._0_4_ = auVar42._0_4_ * fVar208;
        auVar210._4_4_ = auVar42._4_4_ * fVar218;
        auVar210._8_4_ = auVar42._8_4_ * fVar219;
        auVar210._12_4_ = auVar42._12_4_ * fVar220;
        auVar230._0_4_ = auVar43._0_4_ * fVar208;
        auVar230._4_4_ = auVar43._4_4_ * fVar218;
        auVar230._8_4_ = auVar43._8_4_ * fVar219;
        auVar230._12_4_ = auVar43._12_4_ * fVar220;
        auVar196._0_4_ = auVar48._0_4_ * fVar208;
        auVar196._4_4_ = auVar48._4_4_ * fVar218;
        auVar196._8_4_ = auVar48._8_4_ * fVar219;
        auVar196._12_4_ = auVar48._12_4_ * fVar220;
        auVar41 = vfmadd231ps_fma(auVar205,auVar244,auVar37);
        auVar42 = vfmadd231ps_fma(auVar210,auVar244,auVar173);
        auVar34 = vfmadd231ps_fma(auVar230,auVar244,auVar56);
        auVar36 = vfmadd231ps_fma(auVar196,(undefined1  [16])0x0,auVar244);
        auVar54 = vshufpd_avx(auVar41,auVar41,1);
        auVar55 = vshufpd_avx(auVar42,auVar42,1);
        auVar38 = vshufpd_avx512vl(auVar34,auVar34,1);
        auVar59 = vshufpd_avx512vl(auVar36,auVar36,1);
        auVar257 = ZEXT1664(auVar59);
        auVar43 = vminss_avx(auVar41,auVar42);
        auVar41 = vmaxss_avx(auVar42,auVar41);
        auVar48 = vminss_avx(auVar34,auVar36);
        auVar42 = vmaxss_avx(auVar36,auVar34);
        auVar43 = vminss_avx(auVar43,auVar48);
        auVar41 = vmaxss_avx(auVar42,auVar41);
        auVar48 = vminss_avx(auVar54,auVar55);
        auVar42 = vmaxss_avx(auVar55,auVar54);
        auVar54 = vminss_avx512f(auVar38,auVar59);
        auVar55 = vmaxss_avx512f(auVar59,auVar38);
        auVar42 = vmaxss_avx(auVar55,auVar42);
        auVar96._0_16_ = vminss_avx512f(auVar48,auVar54);
        vucomiss_avx512f(auVar43);
        fVar218 = auVar42._0_4_;
        fVar208 = auVar41._0_4_;
        if (4 < (uint)uVar22) {
          bVar33 = fVar218 == -0.0001;
          bVar30 = NAN(fVar218);
          if (fVar218 <= -0.0001) goto LAB_018c8595;
          break;
        }
LAB_018c8595:
        auVar48 = vucomiss_avx512f(auVar96._0_16_);
        bVar33 = fVar218 <= -0.0001;
        bVar31 = -0.0001 < fVar208;
        bVar30 = bVar33;
        if (!bVar33) break;
        uVar14 = vcmpps_avx512vl(auVar43,auVar48,5);
        uVar15 = vcmpps_avx512vl(auVar96._0_16_,auVar48,5);
        bVar20 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar33 = bVar31 && bVar20 == 0;
        bVar30 = bVar31 && bVar20 == 0;
      } while (!bVar31 || bVar20 != 0);
      vcmpss_avx512f(auVar43,auVar39,1);
      auVar34 = auVar264._0_16_;
      uVar14 = vcmpss_avx512f(auVar41,auVar39,1);
      bVar31 = (bool)((byte)uVar14 & 1);
      auVar84._16_48_ = auVar96._16_48_;
      auVar84._0_16_ = auVar34;
      iVar97 = auVar264._0_4_;
      auVar83._4_60_ = auVar84._4_60_;
      auVar83._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * iVar97);
      vucomiss_avx512f(auVar83._0_16_);
      bVar30 = (bool)(!bVar33 | bVar30);
      bVar31 = bVar30 == false;
      auVar86._16_48_ = auVar96._16_48_;
      auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar85._4_60_ = auVar86._4_60_;
      auVar85._0_4_ = (uint)bVar30 * auVar104._0_4_ + (uint)!bVar30 * 0x7f800000;
      auVar54 = auVar85._0_16_;
      auVar88._16_48_ = auVar96._16_48_;
      auVar88._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar87._4_60_ = auVar88._4_60_;
      auVar87._0_4_ = (uint)bVar30 * auVar104._0_4_ + (uint)!bVar30 * -0x800000;
      auVar48 = auVar87._0_16_;
      uVar14 = vcmpss_avx512f(auVar96._0_16_,auVar39,1);
      bVar33 = (bool)((byte)uVar14 & 1);
      auVar90._16_48_ = auVar96._16_48_;
      auVar90._0_16_ = auVar34;
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * iVar97);
      auVar55 = vucomiss_avx512f(auVar89._0_16_);
      auVar257 = ZEXT1664(auVar55);
      if ((bVar30) || (bVar31)) {
        auVar55 = vucomiss_avx512f(auVar43);
        if ((bVar30) || (bVar31)) {
          auVar36 = vxorps_avx512vl(auVar43,auVar265._0_16_);
          auVar257 = ZEXT1664(auVar36);
          auVar43 = vsubss_avx512f(auVar55,auVar43);
          auVar43 = vdivss_avx512f(auVar36,auVar43);
          auVar55 = vsubss_avx512f(auVar34,auVar43);
          auVar43 = vfmadd213ss_avx512f(auVar55,auVar39,auVar43);
          auVar55 = auVar43;
        }
        else {
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          vucomiss_avx512f(auVar55);
          if ((bVar30) || (auVar43 = auVar34, bVar31)) {
            auVar43 = SUB6416(ZEXT464(0xff800000),0);
            auVar55 = ZEXT416(0x7f800000);
          }
        }
        auVar54 = vminss_avx512f(auVar54,auVar55);
        auVar48 = vmaxss_avx(auVar43,auVar48);
      }
      uVar14 = vcmpss_avx512f(auVar42,auVar39,1);
      bVar33 = (bool)((byte)uVar14 & 1);
      fVar219 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * iVar97);
      if ((auVar83._0_4_ != fVar219) || (NAN(auVar83._0_4_) || NAN(fVar219))) {
        if ((fVar218 != fVar208) || (NAN(fVar218) || NAN(fVar208))) {
          auVar41 = vxorps_avx512vl(auVar41,auVar265._0_16_);
          auVar197._0_4_ = auVar41._0_4_ / (fVar218 - fVar208);
          auVar197._4_12_ = auVar41._4_12_;
          auVar41 = vsubss_avx512f(auVar34,auVar197);
          auVar41 = vfmadd213ss_avx512f(auVar41,auVar39,auVar197);
          auVar42 = auVar41;
        }
        else if ((fVar208 != 0.0) ||
                (auVar41 = auVar34, auVar42 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar208))) {
          auVar41 = SUB6416(ZEXT464(0xff800000),0);
          auVar42 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar54 = vminss_avx(auVar54,auVar42);
        auVar48 = vmaxss_avx(auVar41,auVar48);
      }
      bVar33 = auVar89._0_4_ != fVar219;
      auVar41 = vminss_avx512f(auVar54,auVar34);
      auVar92._16_48_ = auVar96._16_48_;
      auVar92._0_16_ = auVar54;
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar33 * auVar41._0_4_ + (uint)!bVar33 * auVar54._0_4_;
      auVar41 = vmaxss_avx512f(auVar34,auVar48);
      auVar94._16_48_ = auVar96._16_48_;
      auVar94._0_16_ = auVar48;
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (uint)bVar33 * auVar41._0_4_ + (uint)!bVar33 * auVar48._0_4_;
      auVar41 = vmaxss_avx512f(auVar39,auVar91._0_16_);
      auVar96._0_16_ = vminss_avx512f(auVar93._0_16_,auVar34);
    } while (auVar96._0_4_ < auVar41._0_4_);
    auVar36 = vmaxss_avx512f(auVar39,ZEXT416((uint)(auVar41._0_4_ + -0.1)));
    auVar38 = vminss_avx512f(ZEXT416((uint)(auVar96._0_4_ + 0.1)),auVar34);
    auVar128._0_8_ = auVar37._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar211._8_8_ = auVar173._0_8_;
    auVar211._0_8_ = auVar173._0_8_;
    auVar231._8_8_ = auVar56._0_8_;
    auVar231._0_8_ = auVar56._0_8_;
    auVar41 = vshufpd_avx(auVar173,auVar173,3);
    auVar42 = vshufpd_avx(auVar56,auVar56,3);
    auVar43 = vshufps_avx(auVar36,auVar38,0);
    auVar245._8_4_ = 0x3f800000;
    auVar245._0_8_ = 0x3f8000003f800000;
    auVar245._12_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar245,auVar43);
    fVar208 = auVar43._0_4_;
    auVar167._0_4_ = fVar208 * auVar51._0_4_;
    fVar218 = auVar43._4_4_;
    auVar167._4_4_ = fVar218 * auVar51._4_4_;
    fVar219 = auVar43._8_4_;
    auVar167._8_4_ = fVar219 * auVar51._8_4_;
    fVar220 = auVar43._12_4_;
    auVar167._12_4_ = fVar220 * auVar51._12_4_;
    auVar174._0_4_ = fVar208 * auVar41._0_4_;
    auVar174._4_4_ = fVar218 * auVar41._4_4_;
    auVar174._8_4_ = fVar219 * auVar41._8_4_;
    auVar174._12_4_ = fVar220 * auVar41._12_4_;
    auVar252._0_4_ = auVar42._0_4_ * fVar208;
    auVar252._4_4_ = auVar42._4_4_ * fVar218;
    auVar252._8_4_ = auVar42._8_4_ * fVar219;
    auVar252._12_4_ = auVar42._12_4_ * fVar220;
    auVar155._0_4_ = fVar208 * auVar53._0_4_;
    auVar155._4_4_ = fVar218 * auVar53._4_4_;
    auVar155._8_4_ = fVar219 * auVar53._8_4_;
    auVar155._12_4_ = fVar220 * auVar53._12_4_;
    auVar51 = vfmadd231ps_fma(auVar167,auVar48,auVar128);
    auVar53 = vfmadd231ps_fma(auVar174,auVar48,auVar211);
    auVar54 = vfmadd231ps_fma(auVar252,auVar48,auVar231);
    auVar55 = vfmadd231ps_fma(auVar155,auVar48,ZEXT816(0));
    auVar42 = vsubss_avx512f(auVar34,auVar36);
    auVar41 = vmovshdup_avx(auVar35);
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar36._0_4_)),auVar35,auVar42);
    auVar42 = vsubss_avx512f(auVar34,auVar38);
    auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar38._0_4_)),auVar35,auVar42);
    auVar56 = vdivss_avx512f(auVar34,ZEXT416((uint)fVar223));
    auVar41 = vsubps_avx(auVar53,auVar51);
    auVar105 = auVar262._0_16_;
    auVar43 = vmulps_avx512vl(auVar41,auVar105);
    auVar41 = vsubps_avx(auVar54,auVar53);
    auVar48 = vmulps_avx512vl(auVar41,auVar105);
    auVar41 = vsubps_avx(auVar55,auVar54);
    auVar41 = vmulps_avx512vl(auVar41,auVar105);
    auVar42 = vminps_avx(auVar48,auVar41);
    auVar41 = vmaxps_avx(auVar48,auVar41);
    auVar42 = vminps_avx(auVar43,auVar42);
    auVar41 = vmaxps_avx(auVar43,auVar41);
    auVar43 = vshufpd_avx(auVar42,auVar42,3);
    auVar48 = vshufpd_avx(auVar41,auVar41,3);
    auVar42 = vminps_avx(auVar42,auVar43);
    auVar41 = vmaxps_avx(auVar41,auVar48);
    fVar223 = auVar56._0_4_;
    auVar198._0_4_ = auVar42._0_4_ * fVar223;
    auVar198._4_4_ = auVar42._4_4_ * fVar223;
    auVar198._8_4_ = auVar42._8_4_ * fVar223;
    auVar198._12_4_ = auVar42._12_4_ * fVar223;
    auVar185._0_4_ = fVar223 * auVar41._0_4_;
    auVar185._4_4_ = fVar223 * auVar41._4_4_;
    auVar185._8_4_ = fVar223 * auVar41._8_4_;
    auVar185._12_4_ = fVar223 * auVar41._12_4_;
    auVar56 = vdivss_avx512f(auVar34,ZEXT416((uint)(auVar38._0_4_ - auVar37._0_4_)));
    auVar41 = vshufpd_avx(auVar51,auVar51,3);
    auVar42 = vshufpd_avx(auVar53,auVar53,3);
    auVar43 = vshufpd_avx(auVar54,auVar54,3);
    auVar48 = vshufpd_avx(auVar55,auVar55,3);
    auVar41 = vsubps_avx(auVar41,auVar51);
    auVar51 = vsubps_avx(auVar42,auVar53);
    auVar53 = vsubps_avx(auVar43,auVar54);
    auVar48 = vsubps_avx(auVar48,auVar55);
    auVar42 = vminps_avx(auVar41,auVar51);
    auVar41 = vmaxps_avx(auVar41,auVar51);
    auVar43 = vminps_avx(auVar53,auVar48);
    auVar43 = vminps_avx(auVar42,auVar43);
    auVar42 = vmaxps_avx(auVar53,auVar48);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    fVar223 = auVar56._0_4_;
    auVar232._0_4_ = fVar223 * auVar43._0_4_;
    auVar232._4_4_ = fVar223 * auVar43._4_4_;
    auVar232._8_4_ = fVar223 * auVar43._8_4_;
    auVar232._12_4_ = fVar223 * auVar43._12_4_;
    auVar212._0_4_ = fVar223 * auVar41._0_4_;
    auVar212._4_4_ = fVar223 * auVar41._4_4_;
    auVar212._8_4_ = fVar223 * auVar41._8_4_;
    auVar212._12_4_ = fVar223 * auVar41._12_4_;
    auVar48 = vinsertps_avx(auVar49,auVar37,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar49,_DAT_01fb9f90,auVar38);
    auVar111._0_4_ = auVar48._0_4_ + auVar59._0_4_;
    auVar111._4_4_ = auVar48._4_4_ + auVar59._4_4_;
    auVar111._8_4_ = auVar48._8_4_ + auVar59._8_4_;
    auVar111._12_4_ = auVar48._12_4_ + auVar59._12_4_;
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar56 = vmulps_avx512vl(auVar111,auVar18);
    auVar42 = vshufps_avx(auVar56,auVar56,0x54);
    uVar98 = auVar56._0_4_;
    auVar114._4_4_ = uVar98;
    auVar114._0_4_ = uVar98;
    auVar114._8_4_ = uVar98;
    auVar114._12_4_ = uVar98;
    auVar43 = vfmadd213ps_fma(local_470,auVar114,auVar57);
    auVar51 = vfmadd213ps_fma(local_480,auVar114,auVar50);
    auVar53 = vfmadd213ps_fma(local_490,auVar114,auVar58);
    auVar41 = vsubps_avx(auVar51,auVar43);
    auVar43 = vfmadd213ps_fma(auVar41,auVar114,auVar43);
    auVar41 = vsubps_avx(auVar53,auVar51);
    auVar41 = vfmadd213ps_fma(auVar41,auVar114,auVar51);
    auVar41 = vsubps_avx(auVar41,auVar43);
    auVar43 = vfmadd231ps_fma(auVar43,auVar41,auVar114);
    auVar54 = vmulps_avx512vl(auVar41,auVar105);
    auVar238._8_8_ = auVar43._0_8_;
    auVar238._0_8_ = auVar43._0_8_;
    auVar41 = vshufpd_avx(auVar43,auVar43,3);
    auVar43 = vshufps_avx(auVar56,auVar56,0x55);
    auVar51 = vsubps_avx(auVar41,auVar238);
    auVar53 = vfmadd231ps_fma(auVar238,auVar43,auVar51);
    auVar253._8_8_ = auVar54._0_8_;
    auVar253._0_8_ = auVar54._0_8_;
    auVar41 = vshufpd_avx(auVar54,auVar54,3);
    auVar41 = vsubps_avx512vl(auVar41,auVar253);
    auVar41 = vfmadd213ps_avx512vl(auVar41,auVar43,auVar253);
    auVar115._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
    auVar115._8_4_ = auVar51._8_4_ ^ 0x80000000;
    auVar115._12_4_ = auVar51._12_4_ ^ 0x80000000;
    auVar43 = vmovshdup_avx512vl(auVar41);
    auVar254._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
    auVar254._8_4_ = auVar43._8_4_ ^ 0x80000000;
    auVar254._12_4_ = auVar43._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar51);
    auVar55 = vpermt2ps_avx512vl(auVar254,ZEXT416(5),auVar51);
    auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar51._0_4_)),auVar41,auVar54);
    auVar51 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar115);
    auVar156._0_4_ = auVar43._0_4_;
    auVar156._4_4_ = auVar156._0_4_;
    auVar156._8_4_ = auVar156._0_4_;
    auVar156._12_4_ = auVar156._0_4_;
    auVar41 = vdivps_avx(auVar55,auVar156);
    auVar60 = vdivps_avx512vl(auVar51,auVar156);
    fVar223 = auVar53._0_4_;
    auVar43 = vshufps_avx(auVar53,auVar53,0x55);
    auVar239._0_4_ = fVar223 * auVar41._0_4_ + auVar43._0_4_ * auVar60._0_4_;
    auVar239._4_4_ = fVar223 * auVar41._4_4_ + auVar43._4_4_ * auVar60._4_4_;
    auVar239._8_4_ = fVar223 * auVar41._8_4_ + auVar43._8_4_ * auVar60._8_4_;
    auVar239._12_4_ = fVar223 * auVar41._12_4_ + auVar43._12_4_ * auVar60._12_4_;
    auVar35 = vsubps_avx(auVar42,auVar239);
    auVar43 = vmovshdup_avx(auVar41);
    auVar42 = vinsertps_avx(auVar198,auVar232,0x1c);
    auVar255._0_4_ = auVar43._0_4_ * auVar42._0_4_;
    auVar255._4_4_ = auVar43._4_4_ * auVar42._4_4_;
    auVar255._8_4_ = auVar43._8_4_ * auVar42._8_4_;
    auVar255._12_4_ = auVar43._12_4_ * auVar42._12_4_;
    auVar36 = vinsertps_avx512f(auVar185,auVar212,0x1c);
    auVar43 = vmulps_avx512vl(auVar43,auVar36);
    auVar55 = vminps_avx512vl(auVar255,auVar43);
    auVar53 = vmaxps_avx(auVar43,auVar255);
    auVar54 = vmovshdup_avx(auVar60);
    auVar43 = vinsertps_avx(auVar232,auVar198,0x4c);
    auVar233._0_4_ = auVar54._0_4_ * auVar43._0_4_;
    auVar233._4_4_ = auVar54._4_4_ * auVar43._4_4_;
    auVar233._8_4_ = auVar54._8_4_ * auVar43._8_4_;
    auVar233._12_4_ = auVar54._12_4_ * auVar43._12_4_;
    auVar51 = vinsertps_avx(auVar212,auVar185,0x4c);
    auVar213._0_4_ = auVar54._0_4_ * auVar51._0_4_;
    auVar213._4_4_ = auVar54._4_4_ * auVar51._4_4_;
    auVar213._8_4_ = auVar54._8_4_ * auVar51._8_4_;
    auVar213._12_4_ = auVar54._12_4_ * auVar51._12_4_;
    auVar54 = vminps_avx(auVar233,auVar213);
    auVar55 = vaddps_avx512vl(auVar55,auVar54);
    auVar54 = vmaxps_avx(auVar213,auVar233);
    auVar214._0_4_ = auVar53._0_4_ + auVar54._0_4_;
    auVar214._4_4_ = auVar53._4_4_ + auVar54._4_4_;
    auVar214._8_4_ = auVar53._8_4_ + auVar54._8_4_;
    auVar214._12_4_ = auVar53._12_4_ + auVar54._12_4_;
    auVar234._8_8_ = 0x3f80000000000000;
    auVar234._0_8_ = 0x3f80000000000000;
    auVar53 = vsubps_avx(auVar234,auVar214);
    auVar54 = vsubps_avx(auVar234,auVar55);
    auVar55 = vsubps_avx(auVar48,auVar56);
    auVar56 = vsubps_avx(auVar59,auVar56);
    fVar220 = auVar55._0_4_;
    auVar256._0_4_ = fVar220 * auVar53._0_4_;
    fVar221 = auVar55._4_4_;
    auVar256._4_4_ = fVar221 * auVar53._4_4_;
    fVar222 = auVar55._8_4_;
    auVar256._8_4_ = fVar222 * auVar53._8_4_;
    fVar170 = auVar55._12_4_;
    auVar256._12_4_ = fVar170 * auVar53._12_4_;
    auVar61 = vbroadcastss_avx512vl(auVar41);
    auVar42 = vmulps_avx512vl(auVar61,auVar42);
    auVar36 = vmulps_avx512vl(auVar61,auVar36);
    auVar61 = vminps_avx512vl(auVar42,auVar36);
    auVar36 = vmaxps_avx512vl(auVar36,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar60);
    auVar43 = vmulps_avx512vl(auVar42,auVar43);
    auVar42 = vmulps_avx512vl(auVar42,auVar51);
    auVar51 = vminps_avx512vl(auVar43,auVar42);
    auVar51 = vaddps_avx512vl(auVar61,auVar51);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    auVar257 = ZEXT1664(auVar55);
    fVar223 = auVar56._0_4_;
    auVar215._0_4_ = fVar223 * auVar53._0_4_;
    fVar208 = auVar56._4_4_;
    auVar215._4_4_ = fVar208 * auVar53._4_4_;
    fVar218 = auVar56._8_4_;
    auVar215._8_4_ = fVar218 * auVar53._8_4_;
    fVar219 = auVar56._12_4_;
    auVar215._12_4_ = fVar219 * auVar53._12_4_;
    auVar235._0_4_ = fVar223 * auVar54._0_4_;
    auVar235._4_4_ = fVar208 * auVar54._4_4_;
    auVar235._8_4_ = fVar218 * auVar54._8_4_;
    auVar235._12_4_ = fVar219 * auVar54._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar43);
    auVar186._0_4_ = auVar36._0_4_ + auVar42._0_4_;
    auVar186._4_4_ = auVar36._4_4_ + auVar42._4_4_;
    auVar186._8_4_ = auVar36._8_4_ + auVar42._8_4_;
    auVar186._12_4_ = auVar36._12_4_ + auVar42._12_4_;
    auVar199._8_8_ = 0x3f800000;
    auVar199._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar199,auVar186);
    auVar43 = vsubps_avx512vl(auVar199,auVar51);
    auVar246._0_4_ = fVar220 * auVar42._0_4_;
    auVar246._4_4_ = fVar221 * auVar42._4_4_;
    auVar246._8_4_ = fVar222 * auVar42._8_4_;
    auVar246._12_4_ = fVar170 * auVar42._12_4_;
    auVar240._0_4_ = fVar220 * auVar43._0_4_;
    auVar240._4_4_ = fVar221 * auVar43._4_4_;
    auVar240._8_4_ = fVar222 * auVar43._8_4_;
    auVar240._12_4_ = fVar170 * auVar43._12_4_;
    auVar187._0_4_ = fVar223 * auVar42._0_4_;
    auVar187._4_4_ = fVar208 * auVar42._4_4_;
    auVar187._8_4_ = fVar218 * auVar42._8_4_;
    auVar187._12_4_ = fVar219 * auVar42._12_4_;
    auVar200._0_4_ = fVar223 * auVar43._0_4_;
    auVar200._4_4_ = fVar208 * auVar43._4_4_;
    auVar200._8_4_ = fVar218 * auVar43._8_4_;
    auVar200._12_4_ = fVar219 * auVar43._12_4_;
    auVar42 = vminps_avx(auVar246,auVar240);
    auVar43 = vminps_avx512vl(auVar187,auVar200);
    auVar51 = vminps_avx512vl(auVar42,auVar43);
    auVar42 = vmaxps_avx(auVar240,auVar246);
    auVar43 = vmaxps_avx(auVar200,auVar187);
    auVar43 = vmaxps_avx(auVar43,auVar42);
    auVar53 = vminps_avx512vl(auVar256,auVar55);
    auVar42 = vminps_avx(auVar215,auVar235);
    auVar42 = vminps_avx(auVar53,auVar42);
    auVar42 = vhaddps_avx(auVar51,auVar42);
    auVar96._0_16_ = vmaxps_avx512vl(auVar55,auVar256);
    auVar51 = vmaxps_avx(auVar235,auVar215);
    auVar51 = vmaxps_avx(auVar51,auVar96._0_16_);
    auVar43 = vhaddps_avx(auVar43,auVar51);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
    auVar188._0_4_ = auVar42._0_4_ + auVar35._0_4_;
    auVar188._4_4_ = auVar42._4_4_ + auVar35._4_4_;
    auVar188._8_4_ = auVar42._8_4_ + auVar35._8_4_;
    auVar188._12_4_ = auVar42._12_4_ + auVar35._12_4_;
    auVar201._0_4_ = auVar43._0_4_ + auVar35._0_4_;
    auVar201._4_4_ = auVar43._4_4_ + auVar35._4_4_;
    auVar201._8_4_ = auVar43._8_4_ + auVar35._8_4_;
    auVar201._12_4_ = auVar43._12_4_ + auVar35._12_4_;
    auVar42 = vmaxps_avx(auVar48,auVar188);
    auVar43 = vminps_avx(auVar201,auVar59);
    uVar3 = vcmpps_avx512vl(auVar43,auVar42,1);
  } while ((uVar3 & 3) != 0);
  uVar3 = vcmpps_avx512vl(auVar201,auVar59,1);
  uVar14 = vcmpps_avx512vl(auVar49,auVar188,1);
  if (((ushort)uVar14 & (ushort)uVar3 & 1) == 0) {
    bVar20 = 0;
  }
  else {
    auVar42 = vmovshdup_avx(auVar188);
    bVar20 = auVar37._0_4_ < auVar42._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar22 || uVar7 != 0 && !bVar32) | bVar20) != 1) goto LAB_018c91fc;
  lVar25 = 0xc9;
  do {
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) goto LAB_018c8362;
    auVar49 = vsubss_avx512f(auVar34,auVar35);
    fVar218 = auVar49._0_4_;
    fVar223 = fVar218 * fVar218 * fVar218;
    auVar49 = vmulss_avx512f(auVar35,ZEXT416(0x40400000));
    fVar208 = auVar49._0_4_ * fVar218 * fVar218;
    fVar219 = auVar35._0_4_;
    auVar49 = vmulss_avx512f(ZEXT416((uint)(fVar219 * fVar219)),ZEXT416(0x40400000));
    fVar218 = fVar218 * auVar49._0_4_;
    auVar139._4_4_ = fVar223;
    auVar139._0_4_ = fVar223;
    auVar139._8_4_ = fVar223;
    auVar139._12_4_ = fVar223;
    auVar129._4_4_ = fVar208;
    auVar129._0_4_ = fVar208;
    auVar129._8_4_ = fVar208;
    auVar129._12_4_ = fVar208;
    auVar101._4_4_ = fVar218;
    auVar101._0_4_ = fVar218;
    auVar101._8_4_ = fVar218;
    auVar101._12_4_ = fVar218;
    fVar219 = fVar219 * fVar219 * fVar219;
    auVar168._0_4_ = (float)local_4a0._0_4_ * fVar219;
    auVar168._4_4_ = (float)local_4a0._4_4_ * fVar219;
    auVar168._8_4_ = fStack_498 * fVar219;
    auVar168._12_4_ = fStack_494 * fVar219;
    auVar49 = vfmadd231ps_fma(auVar168,auVar58,auVar101);
    auVar49 = vfmadd231ps_fma(auVar49,auVar50,auVar129);
    auVar49 = vfmadd231ps_fma(auVar49,auVar57,auVar139);
    auVar102._8_8_ = auVar49._0_8_;
    auVar102._0_8_ = auVar49._0_8_;
    auVar49 = vshufpd_avx(auVar49,auVar49,3);
    auVar42 = vshufps_avx(auVar35,auVar35,0x55);
    auVar49 = vsubps_avx(auVar49,auVar102);
    auVar42 = vfmadd213ps_fma(auVar49,auVar42,auVar102);
    fVar223 = auVar42._0_4_;
    auVar49 = vshufps_avx(auVar42,auVar42,0x55);
    auVar103._0_4_ = auVar41._0_4_ * fVar223 + auVar60._0_4_ * auVar49._0_4_;
    auVar103._4_4_ = auVar41._4_4_ * fVar223 + auVar60._4_4_ * auVar49._4_4_;
    auVar103._8_4_ = auVar41._8_4_ * fVar223 + auVar60._8_4_ * auVar49._8_4_;
    auVar103._12_4_ = auVar41._12_4_ * fVar223 + auVar60._12_4_ * auVar49._12_4_;
    auVar35 = vsubps_avx(auVar35,auVar103);
    auVar49 = vandps_avx512vl(auVar42,auVar263._0_16_);
    auVar96._0_16_ = vprolq_avx512vl(auVar49,0x20);
    auVar49 = vmaxss_avx(auVar96._0_16_,auVar49);
    bVar32 = (float)local_4b0._0_4_ < auVar49._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar49._0_4_);
  auVar49 = vucomiss_avx512f(auVar39);
  if (bVar32) goto LAB_018c8362;
  auVar41 = vucomiss_avx512f(auVar49);
  auVar264 = ZEXT1664(auVar41);
  if (bVar32) goto LAB_018c8362;
  vmovshdup_avx(auVar49);
  auVar41 = vucomiss_avx512f(auVar39);
  if (bVar32) goto LAB_018c8362;
  auVar42 = vucomiss_avx512f(auVar41);
  auVar264 = ZEXT1664(auVar42);
  if (bVar32) goto LAB_018c8362;
  auVar43 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar34 = vinsertps_avx(auVar43,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar43 = vdpps_avx(auVar34,local_4c0,0x7f);
  auVar48 = vdpps_avx(auVar34,local_4d0,0x7f);
  auVar51 = vdpps_avx(auVar34,local_4e0,0x7f);
  auVar53 = vdpps_avx(auVar34,local_4f0,0x7f);
  auVar54 = vdpps_avx(auVar34,local_500,0x7f);
  auVar55 = vdpps_avx(auVar34,local_510,0x7f);
  auVar56 = vdpps_avx(auVar34,local_520,0x7f);
  auVar34 = vdpps_avx(auVar34,local_530,0x7f);
  auVar35 = vsubss_avx512f(auVar42,auVar41);
  fVar223 = auVar41._0_4_;
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar54._0_4_)),auVar35,auVar43);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar223)),auVar35,auVar48);
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar223)),auVar35,auVar51);
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar34._0_4_)),auVar35,auVar53);
  auVar42 = vsubss_avx512f(auVar42,auVar49);
  auVar169._0_4_ = auVar42._0_4_;
  fVar208 = auVar169._0_4_ * auVar169._0_4_ * auVar169._0_4_;
  auVar42 = vmulss_avx512f(auVar49,ZEXT416(0x40400000));
  fVar218 = auVar42._0_4_ * auVar169._0_4_ * auVar169._0_4_;
  fVar223 = auVar49._0_4_;
  auVar157._0_4_ = fVar223 * fVar223;
  auVar157._4_4_ = auVar49._4_4_ * auVar49._4_4_;
  auVar157._8_4_ = auVar49._8_4_ * auVar49._8_4_;
  auVar157._12_4_ = auVar49._12_4_ * auVar49._12_4_;
  auVar96._0_16_ = vmulss_avx512f(auVar157,ZEXT416(0x40400000));
  fVar219 = auVar169._0_4_ * auVar96._0_4_;
  fVar221 = fVar223 * auVar157._0_4_;
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar51._0_4_)),ZEXT416((uint)fVar219),auVar48)
  ;
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar218),auVar43);
  auVar41 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar208),auVar41);
  fVar220 = auVar41._0_4_;
  if ((fVar220 < fVar143) || (fVar222 = *(float *)(ray + k * 4 + 0x200), fVar222 < fVar220))
  goto LAB_018c8362;
  auVar41 = vshufps_avx(auVar49,auVar49,0x55);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar42 = vsubps_avx(auVar189,auVar41);
  fVar170 = auVar41._0_4_;
  auVar202._0_4_ = fVar170 * (float)local_580._0_4_;
  fVar178 = auVar41._4_4_;
  auVar202._4_4_ = fVar178 * (float)local_580._4_4_;
  fVar179 = auVar41._8_4_;
  auVar202._8_4_ = fVar179 * fStack_578;
  fVar180 = auVar41._12_4_;
  auVar202._12_4_ = fVar180 * fStack_574;
  auVar206._0_4_ = fVar170 * (float)local_590._0_4_;
  auVar206._4_4_ = fVar178 * (float)local_590._4_4_;
  auVar206._8_4_ = fVar179 * fStack_588;
  auVar206._12_4_ = fVar180 * fStack_584;
  auVar216._0_4_ = fVar170 * (float)local_5a0._0_4_;
  auVar216._4_4_ = fVar178 * (float)local_5a0._4_4_;
  auVar216._8_4_ = fVar179 * fStack_598;
  auVar216._12_4_ = fVar180 * fStack_594;
  auVar175._0_4_ = fVar170 * (float)local_5b0._0_4_;
  auVar175._4_4_ = fVar178 * (float)local_5b0._4_4_;
  auVar175._8_4_ = fVar179 * fStack_5a8;
  auVar175._12_4_ = fVar180 * fStack_5a4;
  auVar41 = vfmadd231ps_fma(auVar202,auVar42,local_540);
  auVar43 = vfmadd231ps_fma(auVar206,auVar42,local_550);
  auVar48 = vfmadd231ps_fma(auVar216,auVar42,local_560);
  auVar51 = vfmadd231ps_fma(auVar175,auVar42,local_570);
  auVar41 = vsubps_avx(auVar43,auVar41);
  auVar42 = vsubps_avx(auVar48,auVar43);
  auVar43 = vsubps_avx(auVar51,auVar48);
  auVar217._0_4_ = fVar223 * auVar42._0_4_;
  auVar217._4_4_ = fVar223 * auVar42._4_4_;
  auVar217._8_4_ = fVar223 * auVar42._8_4_;
  auVar217._12_4_ = fVar223 * auVar42._12_4_;
  auVar169._4_4_ = auVar169._0_4_;
  auVar169._8_4_ = auVar169._0_4_;
  auVar169._12_4_ = auVar169._0_4_;
  auVar41 = vfmadd231ps_fma(auVar217,auVar169,auVar41);
  auVar176._0_4_ = fVar223 * auVar43._0_4_;
  auVar176._4_4_ = fVar223 * auVar43._4_4_;
  auVar176._8_4_ = fVar223 * auVar43._8_4_;
  auVar176._12_4_ = fVar223 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar176,auVar169,auVar42);
  auVar177._0_4_ = fVar223 * auVar42._0_4_;
  auVar177._4_4_ = fVar223 * auVar42._4_4_;
  auVar177._8_4_ = fVar223 * auVar42._8_4_;
  auVar177._12_4_ = fVar223 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar177,auVar169,auVar41);
  auVar96._0_16_ = vmulps_avx512vl(auVar41,auVar105);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar20 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018c91f4;
    auVar158._0_4_ = fVar221 * (float)local_600._0_4_;
    auVar158._4_4_ = fVar221 * (float)local_600._4_4_;
    auVar158._8_4_ = fVar221 * fStack_5f8;
    auVar158._12_4_ = fVar221 * fStack_5f4;
    auVar140._4_4_ = fVar219;
    auVar140._0_4_ = fVar219;
    auVar140._8_4_ = fVar219;
    auVar140._12_4_ = fVar219;
    auVar41 = vfmadd132ps_fma(auVar140,auVar158,local_5f0);
    auVar130._4_4_ = fVar218;
    auVar130._0_4_ = fVar218;
    auVar130._8_4_ = fVar218;
    auVar130._12_4_ = fVar218;
    auVar41 = vfmadd132ps_fma(auVar130,auVar41,local_5e0);
    auVar116._4_4_ = fVar208;
    auVar116._0_4_ = fVar208;
    auVar116._8_4_ = fVar208;
    auVar116._12_4_ = fVar208;
    auVar43 = vfmadd132ps_fma(auVar116,auVar41,local_5d0);
    auVar41 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar42 = vshufps_avx(auVar96._0_16_,auVar96._0_16_,0xc9);
    auVar117._0_4_ = auVar43._0_4_ * auVar42._0_4_;
    auVar117._4_4_ = auVar43._4_4_ * auVar42._4_4_;
    auVar117._8_4_ = auVar43._8_4_ * auVar42._8_4_;
    auVar117._12_4_ = auVar43._12_4_ * auVar42._12_4_;
    auVar41 = vfmsub231ps_fma(auVar117,auVar96._0_16_,auVar41);
    local_200 = vbroadcastss_avx512f(auVar49);
    auVar95 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar95,ZEXT1664(auVar49));
    auVar95 = vpermps_avx512f(auVar95,ZEXT1664(auVar41));
    auVar96 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar96,ZEXT1664(auVar41));
    local_240 = vbroadcastss_avx512f(auVar41);
    local_2c0[0] = (RTCHitN)auVar95[0];
    local_2c0[1] = (RTCHitN)auVar95[1];
    local_2c0[2] = (RTCHitN)auVar95[2];
    local_2c0[3] = (RTCHitN)auVar95[3];
    local_2c0[4] = (RTCHitN)auVar95[4];
    local_2c0[5] = (RTCHitN)auVar95[5];
    local_2c0[6] = (RTCHitN)auVar95[6];
    local_2c0[7] = (RTCHitN)auVar95[7];
    local_2c0[8] = (RTCHitN)auVar95[8];
    local_2c0[9] = (RTCHitN)auVar95[9];
    local_2c0[10] = (RTCHitN)auVar95[10];
    local_2c0[0xb] = (RTCHitN)auVar95[0xb];
    local_2c0[0xc] = (RTCHitN)auVar95[0xc];
    local_2c0[0xd] = (RTCHitN)auVar95[0xd];
    local_2c0[0xe] = (RTCHitN)auVar95[0xe];
    local_2c0[0xf] = (RTCHitN)auVar95[0xf];
    local_2c0[0x10] = (RTCHitN)auVar95[0x10];
    local_2c0[0x11] = (RTCHitN)auVar95[0x11];
    local_2c0[0x12] = (RTCHitN)auVar95[0x12];
    local_2c0[0x13] = (RTCHitN)auVar95[0x13];
    local_2c0[0x14] = (RTCHitN)auVar95[0x14];
    local_2c0[0x15] = (RTCHitN)auVar95[0x15];
    local_2c0[0x16] = (RTCHitN)auVar95[0x16];
    local_2c0[0x17] = (RTCHitN)auVar95[0x17];
    local_2c0[0x18] = (RTCHitN)auVar95[0x18];
    local_2c0[0x19] = (RTCHitN)auVar95[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar95[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar95[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar95[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar95[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar95[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar95[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar95[0x20];
    local_2c0[0x21] = (RTCHitN)auVar95[0x21];
    local_2c0[0x22] = (RTCHitN)auVar95[0x22];
    local_2c0[0x23] = (RTCHitN)auVar95[0x23];
    local_2c0[0x24] = (RTCHitN)auVar95[0x24];
    local_2c0[0x25] = (RTCHitN)auVar95[0x25];
    local_2c0[0x26] = (RTCHitN)auVar95[0x26];
    local_2c0[0x27] = (RTCHitN)auVar95[0x27];
    local_2c0[0x28] = (RTCHitN)auVar95[0x28];
    local_2c0[0x29] = (RTCHitN)auVar95[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar95[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar95[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar95[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar95[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar95[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar95[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar95[0x30];
    local_2c0[0x31] = (RTCHitN)auVar95[0x31];
    local_2c0[0x32] = (RTCHitN)auVar95[0x32];
    local_2c0[0x33] = (RTCHitN)auVar95[0x33];
    local_2c0[0x34] = (RTCHitN)auVar95[0x34];
    local_2c0[0x35] = (RTCHitN)auVar95[0x35];
    local_2c0[0x36] = (RTCHitN)auVar95[0x36];
    local_2c0[0x37] = (RTCHitN)auVar95[0x37];
    local_2c0[0x38] = (RTCHitN)auVar95[0x38];
    local_2c0[0x39] = (RTCHitN)auVar95[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar95[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar95[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar95[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar95[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar95[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar95[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar95 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar95);
    vpcmpeqd_avx2(auVar95._0_32_,auVar95._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar220;
    auVar96 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar96);
    local_630.valid = (int *)local_400;
    local_630.geometryUserPtr = pGVar8->userPtr;
    local_630.context = context->user;
    local_630.ray = (RTCRayN *)ray;
    local_630.hit = local_2c0;
    local_630.N = 0x10;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_630);
      auVar261 = ZEXT3264(_DAT_01fb9fe0);
      auVar260 = ZEXT464(0x3e2aaaab);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar259 = ZEXT1664(auVar49);
      auVar95._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar258 = ZEXT3264(auVar95._32_32_);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar265 = ZEXT1664(auVar49);
      auVar264 = ZEXT464(0x3f800000);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar262 = ZEXT1664(auVar49);
      auVar49 = vxorps_avx512vl(auVar39,auVar39);
      auVar104 = ZEXT1664(auVar49);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar263 = ZEXT1664(auVar49);
      auVar96 = vmovdqa64_avx512f(local_400);
    }
    auVar49 = auVar104._0_16_;
    uVar14 = vptestmd_avx512f(auVar96,auVar96);
    if ((short)uVar14 != 0) {
      p_Var13 = context->args->filter;
      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var13)(&local_630);
        auVar261 = ZEXT3264(_DAT_01fb9fe0);
        auVar260 = ZEXT464(0x3e2aaaab);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar259 = ZEXT1664(auVar39);
        auVar95._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar258 = ZEXT3264(auVar95._32_32_);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar265 = ZEXT1664(auVar39);
        auVar264 = ZEXT464(0x3f800000);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar262 = ZEXT1664(auVar39);
        auVar49 = vxorps_avx512vl(auVar49,auVar49);
        auVar104 = ZEXT1664(auVar49);
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar263 = ZEXT1664(auVar49);
        auVar96 = vmovdqa64_avx512f(local_400);
      }
      uVar3 = vptestmd_avx512f(auVar96,auVar96);
      auVar95 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar32 = (bool)((byte)uVar3 & 1);
      auVar96._0_4_ = (uint)bVar32 * auVar95._0_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x200)
      ;
      bVar32 = (bool)((byte)(uVar3 >> 1) & 1);
      auVar96._4_4_ = (uint)bVar32 * auVar95._4_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x204)
      ;
      bVar32 = (bool)((byte)(uVar3 >> 2) & 1);
      auVar96._8_4_ = (uint)bVar32 * auVar95._8_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x208)
      ;
      bVar32 = (bool)((byte)(uVar3 >> 3) & 1);
      auVar96._12_4_ =
           (uint)bVar32 * auVar95._12_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x20c);
      bVar32 = (bool)((byte)(uVar3 >> 4) & 1);
      auVar96._16_4_ =
           (uint)bVar32 * auVar95._16_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x210);
      bVar32 = (bool)((byte)(uVar3 >> 5) & 1);
      auVar96._20_4_ =
           (uint)bVar32 * auVar95._20_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x214);
      bVar32 = (bool)((byte)(uVar3 >> 6) & 1);
      auVar96._24_4_ =
           (uint)bVar32 * auVar95._24_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x218);
      bVar32 = (bool)((byte)(uVar3 >> 7) & 1);
      auVar96._28_4_ =
           (uint)bVar32 * auVar95._28_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x21c);
      bVar32 = (bool)((byte)(uVar3 >> 8) & 1);
      auVar96._32_4_ =
           (uint)bVar32 * auVar95._32_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x220);
      bVar32 = (bool)((byte)(uVar3 >> 9) & 1);
      auVar96._36_4_ =
           (uint)bVar32 * auVar95._36_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x224);
      bVar32 = (bool)((byte)(uVar3 >> 10) & 1);
      auVar96._40_4_ =
           (uint)bVar32 * auVar95._40_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x228);
      bVar32 = (bool)((byte)(uVar3 >> 0xb) & 1);
      auVar96._44_4_ =
           (uint)bVar32 * auVar95._44_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x22c);
      bVar32 = (bool)((byte)(uVar3 >> 0xc) & 1);
      auVar96._48_4_ =
           (uint)bVar32 * auVar95._48_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x230);
      bVar32 = (bool)((byte)(uVar3 >> 0xd) & 1);
      auVar96._52_4_ =
           (uint)bVar32 * auVar95._52_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x234);
      bVar32 = (bool)((byte)(uVar3 >> 0xe) & 1);
      auVar96._56_4_ =
           (uint)bVar32 * auVar95._56_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x238);
      bVar32 = SUB81(uVar3 >> 0xf,0);
      auVar96._60_4_ =
           (uint)bVar32 * auVar95._60_4_ | (uint)!bVar32 * *(int *)(local_630.ray + 0x23c);
      *(undefined1 (*) [64])(local_630.ray + 0x200) = auVar96;
      bVar20 = 1;
      if ((short)uVar3 != 0) goto LAB_018c91f4;
    }
    *(float *)(ray + k * 4 + 0x200) = fVar222;
  }
  bVar20 = 0;
LAB_018c91f4:
  bVar29 = (bool)(bVar29 | bVar20);
  goto LAB_018c8362;
LAB_018c91fc:
  auVar35 = vinsertps_avx(auVar37,auVar38,0x10);
  goto LAB_018c7e64;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }